

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O3

void doc_compression_test(void)

{
  size_t keylen;
  size_t keylen_00;
  fdb_encryption_key new_key;
  void *ptr;
  long lVar1;
  fdb_iterator **ppfVar2;
  fdb_status fVar3;
  int iVar4;
  btree *pbVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  fdb_doc *pfVar9;
  fdb_kvs_handle *pfVar10;
  fdb_kvs_handle **ppfVar11;
  long lVar12;
  fdb_kvs_handle *pfVar13;
  fdb_kvs_handle *handle;
  fdb_config *pfVar14;
  fdb_doc *pfVar15;
  char *ptr_handle;
  uint uVar16;
  fdb_doc **unaff_RBP;
  fdb_encryption_key *pfVar17;
  char *pcVar18;
  fdb_config *unaff_R12;
  fdb_iterator **doc;
  fdb_kvs_handle *unaff_R13;
  fdb_file_handle **ptr_fhandle;
  ulong uVar19;
  fdb_doc **doc_00;
  fdb_iterator **ptr_iterator;
  fdb_doc *pfVar20;
  fdb_doc **ppfVar21;
  fdb_kvs_handle **ptr_handle_00;
  char *pcVar22;
  bool bVar23;
  fdb_doc *rdoc;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  char bodybuf [256];
  char temp [256];
  char metabuf [256];
  fdb_config fconfig;
  char keybuf [256];
  fdb_kvs_handle *pfStack_1dc10;
  fdb_file_handle *pfStack_1dc08;
  void *pvStack_1dc00;
  size_t asStack_1dbf8 [3];
  undefined4 uStack_1dbe0;
  undefined4 uStack_1dbdc;
  undefined4 uStack_1dbd8;
  undefined4 uStack_1dbd4;
  undefined4 uStack_1dbd0;
  fdb_kvs_config fStack_1dbc8;
  timeval tStack_1dbb0;
  fdb_config fStack_1dba0;
  char acStack_1daa8 [256];
  char acStack_1d9a8 [256];
  char acStack_1d8a8 [264];
  fdb_config *pfStack_1d7a0;
  fdb_iterator **ppfStack_1d798;
  fdb_kvs_handle *pfStack_1d790;
  fdb_iterator **ppfStack_1d788;
  fdb_kvs_handle *pfStack_1d780;
  code *pcStack_1d778;
  fdb_iterator *pfStack_1d760;
  fdb_file_handle *pfStack_1d758;
  fdb_kvs_handle *pfStack_1d750;
  fdb_kvs_handle *pfStack_1d748;
  fdb_kvs_config fStack_1d740;
  timeval tStack_1d728;
  fdb_config fStack_1d718;
  fdb_iterator *apfStack_1d620 [32];
  fdb_config fStack_1d520;
  fdb_kvs_handle **ppfStack_1d418;
  fdb_iterator **ppfStack_1d410;
  fdb_iterator **ppfStack_1d408;
  fdb_kvs_handle *pfStack_1d400;
  fdb_iterator *pfStack_1d3f0;
  fdb_kvs_handle *pfStack_1d3e8;
  fdb_iterator **ppfStack_1d3e0;
  fdb_kvs_handle *pfStack_1d3d8;
  fdb_kvs_config fStack_1d3d0;
  fdb_kvs_handle *apfStack_1d3b8 [8];
  undefined1 auStack_1d378 [64];
  fdb_iterator *apfStack_1d338 [33];
  fdb_config fStack_1d230;
  fdb_iterator *apfStack_1d138 [32];
  fdb_iterator *apfStack_1d038 [32];
  fdb_kvs_handle fStack_1cf38;
  undefined8 auStack_1cb38 [896];
  fdb_kvs_handle *apfStack_1af38 [1025];
  fdb_doc **ppfStack_18f30;
  char *pcStack_18f28;
  long lStack_18f20;
  fdb_doc *pfStack_18f18;
  fdb_doc **ppfStack_18f10;
  fdb_doc *pfStack_18f08;
  fdb_doc *pfStack_18ef0;
  fdb_file_handle *pfStack_18ee8;
  long lStack_18ee0;
  fdb_kvs_handle *pfStack_18ed8;
  long lStack_18ed0;
  long lStack_18ec8;
  fdb_doc **ppfStack_18ec0;
  long lStack_18eb8;
  fdb_doc **ppfStack_18eb0;
  size_t sStack_18ea8;
  timeval tStack_18ea0;
  fdb_kvs_config fStack_18e90;
  fdb_file_info fStack_18e78;
  fdb_doc afStack_18e30 [3];
  char acStack_18d30 [264];
  fdb_config fStack_18c28;
  char acStack_18b30 [256];
  fdb_doc *apfStack_18a30 [2999];
  size_t sStack_12c78;
  size_t asStack_12c70 [1023];
  undefined1 auStack_10c71 [57225];
  fdb_doc **ppfStack_2ce8;
  fdb_config *pfStack_2ce0;
  fdb_file_handle **ppfStack_2cd8;
  ulong uStack_2cd0;
  fdb_kvs_handle **ppfStack_2cc8;
  fdb_kvs_handle **ppfStack_2cc0;
  fdb_doc *pfStack_2ca8;
  fdb_kvs_handle *pfStack_2ca0;
  undefined1 auStack_2c98 [24];
  fdb_file_handle *pfStack_2c80;
  fdb_kvs_handle *pfStack_2c78;
  fdb_kvs_config fStack_2c70;
  fdb_doc *apfStack_2c58 [31];
  timeval tStack_2b60;
  fdb_config fStack_2b50;
  char acStack_2a58 [256];
  fdb_file_handle *apfStack_2958 [32];
  char acStack_2858 [264];
  fdb_kvs_handle **ppfStack_2750;
  char *pcStack_2748;
  char *pcStack_2740;
  ulong uStack_2738;
  undefined8 uStack_2730;
  code *pcStack_2728;
  fdb_file_handle *pfStack_2720;
  fdb_kvs_handle *pfStack_2718;
  char acStack_2710 [32];
  fdb_kvs_config fStack_26f0;
  timeval tStack_26d8;
  fdb_file_info afStack_26c8 [3];
  fdb_config fStack_25d0;
  fdb_config *pfStack_24d8;
  fdb_kvs_handle **ppfStack_24d0;
  fdb_kvs_handle *pfStack_24c8;
  fdb_doc *pfStack_24c0;
  fdb_kvs_handle *pfStack_24b8;
  fdb_encryption_key *pfStack_24b0;
  fdb_kvs_handle *pfStack_24a0;
  fdb_file_handle *pfStack_2498;
  undefined1 auStack_2490 [8];
  undefined1 auStack_2488 [48];
  fdb_kvs_handle *apfStack_2458 [32];
  fdb_doc afStack_2358 [3];
  fdb_config fStack_2258;
  ulong uStack_2160;
  fdb_kvs_handle **ppfStack_2158;
  fdb_kvs_handle *pfStack_2150;
  fdb_doc *pfStack_2148;
  fdb_kvs_handle *pfStack_2140;
  fdb_encryption_key *pfStack_2138;
  fdb_doc *pfStack_2128;
  fdb_kvs_handle *pfStack_2120;
  fdb_kvs_handle *pfStack_2118;
  fdb_file_handle *pfStack_2110;
  fdb_file_handle *pfStack_2108;
  fdb_doc *apfStack_2100 [11];
  fdb_kvs_config fStack_20a8;
  timeval tStack_2090;
  fdb_kvs_handle fStack_2080;
  fdb_config fStack_1d80;
  fdb_kvs_config *pfStack_1c88;
  fdb_file_handle **ppfStack_1c80;
  fdb_file_handle **ppfStack_1c78;
  fdb_kvs_handle **ppfStack_1c70;
  char *pcStack_1c68;
  fdb_doc **ppfStack_1c60;
  fdb_file_handle *pfStack_1c48;
  fdb_kvs_handle *pfStack_1c40;
  fdb_kvs_handle *pfStack_1c38;
  fdb_file_handle *pfStack_1c30;
  fdb_doc *apfStack_1c28 [31];
  timeval tStack_1b30;
  fdb_kvs_config fStack_1b20;
  char acStack_1b08 [264];
  fdb_config fStack_1a00;
  char acStack_1908 [256];
  char acStack_1808 [264];
  fdb_kvs_handle *pfStack_1700;
  fdb_config *pfStack_16f8;
  fdb_kvs_handle *pfStack_16f0;
  fdb_kvs_handle *pfStack_16e8;
  fdb_kvs_handle **ppfStack_16e0;
  fdb_doc **ppfStack_16d8;
  fdb_kvs_handle *pfStack_16c8;
  fdb_kvs_handle *pfStack_16c0;
  undefined1 auStack_16b8 [32];
  undefined1 auStack_1698 [280];
  fdb_doc *apfStack_1580 [33];
  fdb_config fStack_1478;
  fdb_config fStack_1380;
  fdb_kvs_handle *pfStack_1278;
  fdb_config *pfStack_1270;
  fdb_kvs_handle *pfStack_1268;
  fdb_doc *pfStack_1260;
  fdb_doc **ppfStack_1258;
  fdb_doc **ppfStack_1250;
  fdb_doc *pfStack_1240;
  fdb_kvs_handle *pfStack_1238;
  fdb_doc *pfStack_1230;
  fdb_doc *apfStack_1228 [5];
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1200;
  timeval tStack_11d0;
  fdb_doc afStack_11c0 [3];
  fdb_doc *apfStack_10a8 [32];
  char acStack_fa8 [256];
  fdb_config fStack_ea8;
  fdb_doc *pfStack_db0;
  fdb_config *pfStack_da8;
  fdb_kvs_handle *pfStack_da0;
  btree *pbStack_d98;
  fdb_doc *pfStack_d90;
  fdb_doc **ppfStack_d88;
  undefined1 auStack_d70 [16];
  undefined1 auStack_d60 [24];
  timeval tStack_d48;
  undefined1 auStack_d38 [280];
  fdb_doc *apfStack_c20 [5];
  fdb_config *pfStack_bf8;
  size_t *psStack_a90;
  btree abStack_900 [4];
  char acStack_800 [256];
  fdb_config fStack_700;
  fdb_kvs_handle **ppfStack_608;
  fdb_config *pfStack_600;
  fdb_kvs_handle *pfStack_5f8;
  fdb_kvs_handle *pfStack_5f0;
  btree *pbStack_5e8;
  fdb_doc **ppfStack_5e0;
  fdb_kvs_handle *local_5d0;
  undefined1 local_5c8 [16];
  undefined1 local_5b8 [40];
  btree *local_590;
  undefined1 local_560 [40];
  undefined1 local_538 [256];
  undefined8 local_438;
  uint64_t uStack_430;
  uint64_t local_428;
  snap_handle *psStack_420;
  uint local_418;
  undefined4 uStack_414;
  undefined4 uStack_410;
  undefined4 uStack_40c;
  undefined4 local_408;
  undefined4 uStack_404;
  undefined4 uStack_400;
  undefined4 uStack_3fc;
  atomic<unsigned_char> local_3f8;
  char local_338 [264];
  fdb_config local_230;
  char local_138 [264];
  
  ppfStack_5e0 = (fdb_doc **)0x11611f;
  gettimeofday((timeval *)(local_560 + 0x18),(__timezone_ptr_t)0x0);
  ppfStack_5e0 = (fdb_doc **)0x116124;
  memleak_start();
  local_5d0 = (fdb_kvs_handle *)0x0;
  ppfStack_5e0 = (fdb_doc **)0x116135;
  system("rm -rf  dummy* > errorlog.txt");
  ppfStack_5e0 = (fdb_doc **)0x116145;
  fdb_get_default_config();
  pfVar10 = (fdb_kvs_handle *)local_560;
  ppfStack_5e0 = (fdb_doc **)0x116152;
  fdb_get_default_kvs_config();
  local_230.buffercache_size = 0;
  local_230.wal_threshold = 0x400;
  local_230.flags = 1;
  local_230.compress_document_body = true;
  local_230.compaction_threshold = '\0';
  local_230.purging_interval = 1;
  pbVar5 = (btree *)(local_5c8 + 8);
  ppfStack_5e0 = (fdb_doc **)0x116188;
  fdb_open((fdb_file_handle **)pbVar5,"./dummy1",&local_230);
  ppfVar11 = (fdb_kvs_handle **)local_5c8;
  ppfStack_5e0 = (fdb_doc **)0x11619b;
  fdb_kvs_open_default((fdb_file_handle *)local_5c8._8_8_,ppfVar11,(fdb_kvs_config *)pfVar10);
  ppfStack_5e0 = (fdb_doc **)0x1161b1;
  fVar3 = fdb_set_log_callback
                    ((fdb_kvs_handle *)local_5c8._0_8_,logCallbackFunc,"doc_compression_test");
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001166b7;
  local_428 = 0x6161616161616161;
  psStack_420 = (snap_handle *)0x6161616161616161;
  local_438 = 0x6161616161616161;
  uStack_430 = 0x6161616161616161;
  local_418 = local_418 & 0xffffff00;
  unaff_R13 = (fdb_kvs_handle *)0x0;
  uVar19 = 0;
  do {
    ppfStack_5e0 = (fdb_doc **)0x1161f5;
    sprintf(local_138,"key%d",uVar19 & 0xffffffff);
    ppfStack_5e0 = (fdb_doc **)0x11620e;
    sprintf(local_338,"meta%d",uVar19 & 0xffffffff);
    ppfStack_5e0 = (fdb_doc **)0x11622f;
    sprintf(local_538,"body%d_%s",uVar19 & 0xffffffff,&local_438);
    unaff_R12 = (fdb_config *)(local_5b8 + (long)unaff_R13);
    ppfStack_5e0 = (fdb_doc **)0x11623f;
    unaff_RBP = (fdb_doc **)strlen(local_138);
    ppfStack_5e0 = (fdb_doc **)0x116252;
    pbVar5 = (btree *)strlen(local_338);
    ppfStack_5e0 = (fdb_doc **)0x116262;
    sVar6 = strlen(local_538);
    ppfStack_5e0 = (fdb_doc **)0x116287;
    fdb_doc_create((fdb_doc **)unaff_R12,local_138,(size_t)unaff_RBP,local_338,(size_t)pbVar5,
                   local_538,sVar6);
    ppfStack_5e0 = (fdb_doc **)0x116296;
    fdb_set((fdb_kvs_handle *)local_5c8._0_8_,*(fdb_doc **)(local_5b8 + uVar19 * 8));
    uVar19 = uVar19 + 1;
    unaff_R13 = (fdb_kvs_handle *)((long)unaff_R13 + 8);
  } while (uVar19 != 10);
  keylen._0_1_ = local_590->ksize;
  keylen._1_1_ = local_590->vsize;
  keylen._2_2_ = local_590->height;
  keylen._4_4_ = local_590->blksize;
  ppfVar11 = &local_5d0;
  ppfStack_5e0 = (fdb_doc **)0x1162d3;
  fdb_doc_create((fdb_doc **)ppfVar11,local_590->kv_ops,keylen,*(void **)(local_590 + 1),
                 local_590->root_bid,(void *)0x0,0);
  ppfStack_5e0 = (fdb_doc **)0x1162e0;
  fVar3 = fdb_del((fdb_kvs_handle *)local_5c8._0_8_,(fdb_doc *)local_5d0);
  pfVar10 = (fdb_kvs_handle *)0xa;
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001166bc;
  ppfStack_5e0 = (fdb_doc **)0x1162f2;
  fdb_doc_free((fdb_doc *)local_5d0);
  local_5d0 = (fdb_kvs_handle *)0x0;
  ppfVar11 = (fdb_kvs_handle **)(local_5c8 + 8);
  ppfStack_5e0 = (fdb_doc **)0x11630a;
  fdb_commit((fdb_file_handle *)local_5c8._8_8_,'\0');
  pfVar10 = (fdb_kvs_handle *)local_5c8;
  ppfStack_5e0 = (fdb_doc **)0x116317;
  fdb_kvs_close((fdb_kvs_handle *)local_5c8._0_8_);
  ppfStack_5e0 = (fdb_doc **)0x11631f;
  fdb_close((fdb_file_handle *)local_5c8._8_8_);
  ppfStack_5e0 = (fdb_doc **)0x116336;
  fdb_open((fdb_file_handle **)ppfVar11,"./dummy1",&local_230);
  ppfStack_5e0 = (fdb_doc **)0x116346;
  fdb_kvs_open_default
            ((fdb_file_handle *)local_5c8._8_8_,(fdb_kvs_handle **)pfVar10,
             (fdb_kvs_config *)local_560);
  ppfStack_5e0 = (fdb_doc **)0x11635c;
  fVar3 = fdb_set_log_callback
                    ((fdb_kvs_handle *)local_5c8._0_8_,logCallbackFunc,"doc_compression_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    local_408 = 0x62626262;
    uStack_404 = 0x62626262;
    uStack_400 = 0x62626262;
    uStack_3fc = 0x62626262;
    local_418 = 0x62626262;
    uStack_414 = 0x62626262;
    uStack_410 = 0x62626262;
    uStack_40c = 0x62626262;
    local_428 = 0x6262626262626262;
    psStack_420 = (snap_handle *)0x6262626262626262;
    local_438 = 0x6262626262626262;
    uStack_430 = 0x6262626262626262;
    local_3f8.super___atomic_base<unsigned_char>._M_i = (__atomic_base<unsigned_char>)'\0';
    unaff_R13 = (fdb_kvs_handle *)0x0;
    ppfStack_5e0 = (fdb_doc **)0x1163a9;
    sprintf(local_338,"newmeta%d",0);
    ppfStack_5e0 = (fdb_doc **)0x1163c7;
    sprintf((char *)local_538,"newbody%d_%s",0,&local_438);
    ppfStack_5e0 = (fdb_doc **)0x1163cf;
    unaff_RBP = (fdb_doc **)strlen(local_338);
    ppfStack_5e0 = (fdb_doc **)0x1163da;
    sVar6 = strlen((char *)local_538);
    ppfStack_5e0 = (fdb_doc **)0x1163f3;
    fdb_doc_update((fdb_doc **)local_5b8,local_338,(size_t)unaff_RBP,(fdb_kvs_handle *)local_538,
                   sVar6);
    ppfStack_5e0 = (fdb_doc **)0x116401;
    fdb_set((fdb_kvs_handle *)local_5c8._0_8_,(fdb_doc *)local_5b8._0_8_);
    ppfStack_5e0 = (fdb_doc **)0x116417;
    sprintf(local_338,"newmeta%d",1);
    ppfStack_5e0 = (fdb_doc **)0x116430;
    sprintf((char *)local_538,"newbody%d_%s",1,&local_438);
    pbVar5 = (btree *)(local_5b8 + 8);
    ppfStack_5e0 = (fdb_doc **)0x11643d;
    unaff_R12 = (fdb_config *)strlen(local_338);
    ppfStack_5e0 = (fdb_doc **)0x116448;
    sVar6 = strlen((char *)local_538);
    ppfStack_5e0 = (fdb_doc **)0x11645c;
    fdb_doc_update((fdb_doc **)pbVar5,local_338,(size_t)unaff_R12,(fdb_kvs_handle *)local_538,sVar6)
    ;
    ppfStack_5e0 = (fdb_doc **)0x116469;
    fdb_set((fdb_kvs_handle *)local_5c8._0_8_,(fdb_doc *)local_5b8._8_8_);
    ppfStack_5e0 = (fdb_doc **)0x116475;
    fdb_commit((fdb_file_handle *)local_5c8._8_8_,'\0');
    pfVar13 = (fdb_kvs_handle *)local_538;
    do {
      ppfStack_5e0 = (fdb_doc **)0x11649e;
      fdb_doc_create((fdb_doc **)&local_5d0,
                     (void *)(*(size_t **)(local_5b8 + (long)unaff_R13 * 8))[4],
                     **(size_t **)(local_5b8 + (long)unaff_R13 * 8),(void *)0x0,0,(void *)0x0,0);
      ppfStack_5e0 = (fdb_doc **)0x1164ad;
      fVar3 = fdb_get((fdb_kvs_handle *)local_5c8._0_8_,(fdb_doc *)local_5d0);
      pfVar10 = local_5d0;
      if (unaff_R13 != (fdb_kvs_handle *)0x5) {
        if (fVar3 == FDB_RESULT_SUCCESS) {
          pbVar5 = local_5d0->staletree;
          unaff_RBP = *(fdb_doc ***)(local_5b8 + (long)unaff_R13 * 8);
          unaff_R12 = (fdb_config *)unaff_RBP[7];
          ppfStack_5e0 = (fdb_doc **)0x1164ec;
          iVar4 = bcmp(pbVar5,unaff_R12,(size_t)(local_5d0->kvs_config).custom_cmp);
          if (iVar4 == 0) {
            pbVar5 = (pfVar10->field_6).seqtree;
            unaff_R12 = (fdb_config *)unaff_RBP[8];
            ppfStack_5e0 = (fdb_doc **)0x11650b;
            iVar4 = bcmp(pbVar5,unaff_R12,(size_t)(pfVar10->kvs_config).custom_cmp_param);
            if (iVar4 == 0) goto LAB_00116513;
            ppfStack_5e0 = (fdb_doc **)0x116682;
            doc_compression_test();
            pfVar13 = pfVar10;
            goto LAB_00116682;
          }
        }
        else {
LAB_00116682:
          pfVar10 = pfVar13;
          ppfStack_5e0 = (fdb_doc **)0x116687;
          doc_compression_test();
        }
        ppfStack_5e0 = (fdb_doc **)0x116692;
        doc_compression_test();
        pfVar13 = pfVar10;
LAB_00116692:
        ppfStack_5e0 = (fdb_doc **)0x116697;
        doc_compression_test();
        goto LAB_00116697;
      }
      if (fVar3 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_00116692;
LAB_00116513:
      ppfStack_5e0 = (fdb_doc **)0x11651b;
      fdb_doc_free((fdb_doc *)pfVar10);
      local_5d0 = (fdb_kvs_handle *)0x0;
      unaff_R13 = (fdb_kvs_handle *)&(unaff_R13->kvs_config).field_0x1;
      pfVar13 = pfVar10;
    } while (unaff_R13 != (fdb_kvs_handle *)0xa);
    ppfStack_5e0 = (fdb_doc **)0x116542;
    fdb_compact((fdb_file_handle *)local_5c8._8_8_,"./dummy2");
    unaff_R13 = (fdb_kvs_handle *)0x0;
    do {
      ppfStack_5e0 = (fdb_doc **)0x11656e;
      fdb_doc_create((fdb_doc **)&local_5d0,
                     (void *)(*(size_t **)(local_5b8 + (long)unaff_R13 * 8))[4],
                     **(size_t **)(local_5b8 + (long)unaff_R13 * 8),(void *)0x0,0,(void *)0x0,0);
      ppfStack_5e0 = (fdb_doc **)0x11657d;
      fVar3 = fdb_get((fdb_kvs_handle *)local_5c8._0_8_,(fdb_doc *)local_5d0);
      pfVar13 = local_5d0;
      if (unaff_R13 == (fdb_kvs_handle *)0x5) {
        if (fVar3 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001166b2;
      }
      else {
        if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001166a2;
        pbVar5 = local_5d0->staletree;
        unaff_RBP = *(fdb_doc ***)(local_5b8 + (long)unaff_R13 * 8);
        unaff_R12 = (fdb_config *)unaff_RBP[7];
        ppfStack_5e0 = (fdb_doc **)0x1165bc;
        iVar4 = bcmp(pbVar5,unaff_R12,(size_t)(local_5d0->kvs_config).custom_cmp);
        if (iVar4 != 0) goto LAB_001166a7;
        pbVar5 = (pfVar13->field_6).seqtree;
        unaff_R12 = (fdb_config *)unaff_RBP[8];
        ppfStack_5e0 = (fdb_doc **)0x1165db;
        iVar4 = bcmp(pbVar5,unaff_R12,(size_t)(pfVar13->kvs_config).custom_cmp_param);
        if (iVar4 != 0) goto LAB_00116697;
      }
      ppfStack_5e0 = (fdb_doc **)0x1165eb;
      fdb_doc_free((fdb_doc *)pfVar13);
      local_5d0 = (fdb_kvs_handle *)0x0;
      unaff_R13 = (fdb_kvs_handle *)&(unaff_R13->kvs_config).field_0x1;
      pfVar10 = pfVar13;
      if (unaff_R13 == (fdb_kvs_handle *)0xa) {
        lVar12 = 0;
        do {
          ppfStack_5e0 = (fdb_doc **)0x11660d;
          fdb_doc_free(*(fdb_doc **)(local_5b8 + lVar12 * 8));
          lVar12 = lVar12 + 1;
        } while (lVar12 != 10);
        ppfStack_5e0 = (fdb_doc **)0x116620;
        fdb_kvs_close((fdb_kvs_handle *)local_5c8._0_8_);
        ppfStack_5e0 = (fdb_doc **)0x11662a;
        fdb_close((fdb_file_handle *)local_5c8._8_8_);
        ppfStack_5e0 = (fdb_doc **)0x11662f;
        fdb_shutdown();
        ppfStack_5e0 = (fdb_doc **)0x116634;
        memleak_end();
        pcVar18 = "%s PASSED\n";
        if (doc_compression_test()::__test_pass != '\0') {
          pcVar18 = "%s FAILED\n";
        }
        ppfStack_5e0 = (fdb_doc **)0x116665;
        fprintf(_stderr,pcVar18,"document compression test");
        return;
      }
    } while( true );
  }
  goto LAB_001166c1;
LAB_001171b8:
  ppfStack_1250 = (fdb_doc **)0x1171bd;
  purge_logically_deleted_doc_test();
LAB_001171bd:
  pfVar15 = pfVar9;
  ppfStack_1250 = (fdb_doc **)0x1171c2;
  purge_logically_deleted_doc_test();
LAB_001171c2:
  ppfStack_1250 = (fdb_doc **)0x1171c7;
  purge_logically_deleted_doc_test();
LAB_001171c7:
  ppfStack_1250 = (fdb_doc **)0x1171d2;
  purge_logically_deleted_doc_test();
LAB_001171d2:
  ppfStack_1250 = (fdb_doc **)0x1171d7;
  purge_logically_deleted_doc_test();
LAB_001171d7:
  ppfStack_1250 = (fdb_doc **)0x1171e2;
  purge_logically_deleted_doc_test();
  pfVar10 = pfVar13;
  pfVar9 = pfVar15;
LAB_001171e2:
  ppfStack_1250 = (fdb_doc **)0x1171e7;
  purge_logically_deleted_doc_test();
  goto LAB_001171e7;
LAB_001174ec:
  ppfStack_16d8 = (fdb_doc **)0x1174fc;
  api_wrapper_test();
LAB_001174fc:
  ppfStack_16d8 = (fdb_doc **)0x117501;
  api_wrapper_test();
LAB_00117501:
  pfVar13 = (fdb_kvs_handle *)(auStack_1698 + 0x18);
  ppfStack_16d8 = (fdb_doc **)0x117506;
  api_wrapper_test();
  goto LAB_00117506;
LAB_00118042:
  pfStack_2138 = (fdb_encryption_key *)0x118052;
  flush_before_commit_multi_writers_test();
  pfVar15 = pfVar9;
  goto LAB_00118052;
LAB_00118398:
  pfStack_24b0 = (fdb_encryption_key *)0x1183a5;
  auto_commit_test();
  pfVar13 = (fdb_kvs_handle *)pcVar18;
LAB_001183a5:
  pcVar18 = (char *)pfVar13;
  pfStack_24b0 = (fdb_encryption_key *)0x1183aa;
  auto_commit_test();
LAB_001183aa:
  pfStack_24b0 = (fdb_encryption_key *)0x1183b7;
  auto_commit_test();
  pfVar13 = (fdb_kvs_handle *)pcVar18;
LAB_001183b7:
  pfVar9 = afStack_2358;
  ppfVar11 = apfStack_2458;
  pfStack_24b0 = (fdb_encryption_key *)0x1183bc;
  auto_commit_test();
  goto LAB_001183bc;
LAB_0011968a:
  pfStack_1d400 = (fdb_kvs_handle *)0x11968f;
  open_multi_files_kvs_test();
LAB_0011968f:
  pfStack_1d400 = (fdb_kvs_handle *)0x119694;
  open_multi_files_kvs_test();
LAB_00119694:
  pfStack_1d400 = (fdb_kvs_handle *)0x119699;
  open_multi_files_kvs_test();
LAB_00119699:
  pfStack_1d400 = (fdb_kvs_handle *)0x11969e;
  open_multi_files_kvs_test();
  pfVar10 = (fdb_kvs_handle *)pcVar22;
LAB_0011969e:
  pfStack_1d400 = (fdb_kvs_handle *)0x1196a3;
  open_multi_files_kvs_test();
LAB_001196a3:
  pfStack_1d400 = (fdb_kvs_handle *)0x1196a8;
  open_multi_files_kvs_test();
LAB_001196a8:
  pfStack_1d400 = (fdb_kvs_handle *)0x1196ad;
  open_multi_files_kvs_test();
LAB_001196ad:
  pfStack_1d400 = (fdb_kvs_handle *)0x1196b2;
  open_multi_files_kvs_test();
LAB_001196b2:
  pfStack_1d400 = (fdb_kvs_handle *)0x1196b7;
  open_multi_files_kvs_test();
  goto LAB_001196b7;
LAB_00119c56:
  rekey_test();
  goto LAB_00119c66;
LAB_00116697:
  ppfStack_5e0 = (fdb_doc **)0x1166a2;
  doc_compression_test();
  pfVar10 = pfVar13;
LAB_001166a2:
  pfVar13 = pfVar10;
  ppfStack_5e0 = (fdb_doc **)0x1166a7;
  doc_compression_test();
LAB_001166a7:
  ppfStack_5e0 = (fdb_doc **)0x1166b2;
  doc_compression_test();
  pfVar10 = pfVar13;
LAB_001166b2:
  ppfVar11 = &local_5d0;
  ppfStack_5e0 = (fdb_doc **)0x1166b7;
  doc_compression_test();
LAB_001166b7:
  ppfStack_5e0 = (fdb_doc **)0x1166bc;
  doc_compression_test();
LAB_001166bc:
  ppfStack_5e0 = (fdb_doc **)0x1166c1;
  doc_compression_test();
LAB_001166c1:
  ppfStack_5e0 = (fdb_doc **)read_doc_by_offset_test;
  doc_compression_test();
  ppfStack_d88 = (fdb_doc **)0x1166e3;
  ppfStack_608 = ppfVar11;
  pfStack_600 = unaff_R12;
  pfStack_5f8 = unaff_R13;
  pfStack_5f0 = pfVar10;
  pbStack_5e8 = pbVar5;
  ppfStack_5e0 = unaff_RBP;
  gettimeofday(&tStack_d48,(__timezone_ptr_t)0x0);
  ppfStack_d88 = (fdb_doc **)0x1166e8;
  memleak_start();
  ppfStack_d88 = (fdb_doc **)0x1166f4;
  system("rm -rf  dummy* > errorlog.txt");
  ppfStack_d88 = (fdb_doc **)0x116704;
  fdb_get_default_config();
  pbVar5 = (btree *)auStack_d38;
  ppfStack_d88 = (fdb_doc **)0x116711;
  fdb_get_default_kvs_config();
  fStack_700.buffercache_size = 0;
  fStack_700.wal_threshold = 0x400;
  fStack_700.flags = 1;
  fStack_700.purging_interval = 0xe10;
  fStack_700.compaction_threshold = '\0';
  pfVar9 = (fdb_doc *)auStack_d60;
  ppfStack_d88 = (fdb_doc **)0x11674a;
  fdb_open((fdb_file_handle **)pfVar9,"./dummy1",&fStack_700);
  pfVar15 = (fdb_doc *)(auStack_d70 + 8);
  ppfStack_d88 = (fdb_doc **)0x11675d;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_d60._0_8_,(fdb_kvs_handle **)pfVar15,
             (fdb_kvs_config *)pbVar5);
  ppfStack_d88 = (fdb_doc **)0x116773;
  fVar3 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_d70._8_8_,logCallbackFunc,"read_doc_by_offset_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    lVar12 = 0;
    uVar19 = 0;
    do {
      ppfStack_d88 = (fdb_doc **)0x11679b;
      sprintf(acStack_800,"key%d",uVar19 & 0xffffffff);
      ppfStack_d88 = (fdb_doc **)0x1167b3;
      sprintf((char *)abStack_900,"meta%d",uVar19 & 0xffffffff);
      ppfStack_d88 = (fdb_doc **)0x1167c8;
      sprintf(auStack_d38 + 0x18,"body%d",uVar19 & 0xffffffff);
      ppfStack_d88 = (fdb_doc **)0x1167db;
      sVar6 = strlen(acStack_800);
      ppfStack_d88 = (fdb_doc **)0x1167ee;
      sVar7 = strlen((char *)abStack_900);
      ppfStack_d88 = (fdb_doc **)0x1167fb;
      sVar8 = strlen(auStack_d38 + 0x18);
      ppfStack_d88 = (fdb_doc **)0x11681d;
      fdb_doc_create((fdb_doc **)((long)apfStack_c20 + lVar12),acStack_800,sVar6,abStack_900,sVar7,
                     auStack_d38 + 0x18,sVar8);
      ppfStack_d88 = (fdb_doc **)0x11682f;
      fdb_set((fdb_kvs_handle *)auStack_d70._8_8_,apfStack_c20[uVar19]);
      uVar19 = uVar19 + 1;
      lVar12 = lVar12 + 8;
    } while (uVar19 != 100);
    ppfStack_d88 = (fdb_doc **)0x11684c;
    fdb_commit((fdb_file_handle *)auStack_d60._0_8_,'\0');
    pbVar5 = abStack_900;
    unaff_R12 = (fdb_config *)(auStack_d38 + 0x18);
    pfVar9 = (fdb_doc *)0x0;
    uVar19 = 0;
    do {
      ppfStack_d88 = (fdb_doc **)0x116873;
      sprintf((char *)pbVar5,"meta2%d",uVar19 & 0xffffffff);
      ppfStack_d88 = (fdb_doc **)0x116887;
      sprintf((char *)unaff_R12,"body2%d",uVar19 & 0xffffffff);
      unaff_RBP = (fdb_doc **)((long)apfStack_c20 + (long)pfVar9);
      ppfStack_d88 = (fdb_doc **)0x11689a;
      sVar6 = strlen((char *)pbVar5);
      ppfStack_d88 = (fdb_doc **)0x1168a5;
      sVar7 = strlen((char *)unaff_R12);
      ppfStack_d88 = (fdb_doc **)0x1168b9;
      fdb_doc_update(unaff_RBP,pbVar5,sVar6,unaff_R12,sVar7);
      ppfStack_d88 = (fdb_doc **)0x1168cb;
      fdb_set((fdb_kvs_handle *)auStack_d70._8_8_,apfStack_c20[uVar19]);
      uVar19 = uVar19 + 1;
      pfVar9 = (fdb_doc *)((long)pfVar9 + 8);
    } while (uVar19 != 0x32);
    pfVar15 = (fdb_doc *)auStack_d70;
    ppfStack_d88 = (fdb_doc **)0x116907;
    fdb_doc_create((fdb_doc **)pfVar15,(void *)psStack_a90[4],*psStack_a90,(void *)psStack_a90[7],
                   psStack_a90[1],(void *)0x0,0);
    ppfStack_d88 = (fdb_doc **)0x116914;
    fVar3 = fdb_del((fdb_kvs_handle *)auStack_d70._8_8_,(fdb_doc *)auStack_d70._0_8_);
    unaff_R13 = (fdb_kvs_handle *)0x32;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00116c56;
    pfVar15 = (fdb_doc *)auStack_d70;
    ppfStack_d88 = (fdb_doc **)0x116929;
    fdb_doc_free((fdb_doc *)auStack_d70._0_8_);
    pbVar5 = (btree *)0x0;
    auStack_d70._0_8_ = (fdb_doc *)0x0;
    ppfStack_d88 = (fdb_doc **)0x11693b;
    fdb_commit((fdb_file_handle *)auStack_d60._0_8_,'\0');
    ppfStack_d88 = (fdb_doc **)0x11695e;
    fdb_doc_create((fdb_doc **)pfVar15,*(void **)&pfStack_bf8->seqtree_opt,
                   *(size_t *)&pfStack_bf8->chunksize,(void *)0x0,0,(void *)0x0,0);
    ppfStack_d88 = (fdb_doc **)0x11696b;
    fVar3 = fdb_get_metaonly((fdb_kvs_handle *)auStack_d70._8_8_,(fdb_doc *)auStack_d70._0_8_);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00116c5b;
    pfVar15 = (fdb_doc *)auStack_d70._0_8_;
    if (*(bool *)(auStack_d70._0_8_ + 0x48) != false) {
      ppfStack_d88 = (fdb_doc **)0x116990;
      read_doc_by_offset_test();
      pfVar15 = (fdb_doc *)auStack_d60._8_8_;
    }
    pbVar5 = (btree *)pfVar15->meta;
    pfVar9 = (fdb_doc *)pfStack_bf8->compactor_sleep_duration;
    ppfStack_d88 = (fdb_doc **)0x1169b2;
    iVar4 = bcmp(pbVar5,pfVar9,pfVar15->metalen);
    if (iVar4 != 0) goto LAB_00116c60;
    ppfStack_d88 = (fdb_doc **)0x1169c7;
    fVar3 = fdb_get_byoffset((fdb_kvs_handle *)auStack_d70._8_8_,pfVar15);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00116c6b;
    pfVar9 = (fdb_doc *)auStack_d70._0_8_;
    if (*(bool *)(auStack_d70._0_8_ + 0x48) != false) {
      ppfStack_d88 = (fdb_doc **)0x1169ed;
      read_doc_by_offset_test();
      pfVar9 = (fdb_doc *)auStack_d60._8_8_;
    }
    unaff_R12 = pfStack_bf8;
    pfVar15 = (fdb_doc *)pfVar9->meta;
    pbVar5 = (btree *)pfStack_bf8->compactor_sleep_duration;
    ppfStack_d88 = (fdb_doc **)0x116a10;
    iVar4 = bcmp(pfVar15,pbVar5,pfVar9->metalen);
    if (iVar4 != 0) goto LAB_00116c70;
    pfVar15 = (fdb_doc *)pfVar9->body;
    pbVar5 = *(btree **)&unaff_R12->multi_kv_instances;
    ppfStack_d88 = (fdb_doc **)0x116a30;
    iVar4 = bcmp(pfVar15,pbVar5,pfVar9->bodylen);
    if (iVar4 != 0) goto LAB_00116c7b;
    pfVar15 = (fdb_doc *)(auStack_d60 + 0x10);
    ppfStack_d88 = (fdb_doc **)0x116a59;
    fdb_doc_create((fdb_doc **)pfVar15,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
    *(uint64_t *)(auStack_d60._16_8_ + 0x30) = *(uint64_t *)(auStack_d70._0_8_ + 0x30);
    ppfStack_d88 = (fdb_doc **)0x116a73;
    fVar3 = fdb_get_byoffset((fdb_kvs_handle *)auStack_d70._8_8_,(fdb_doc *)auStack_d60._16_8_);
    pfVar20 = (fdb_doc *)auStack_d60._16_8_;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00116c86;
    pfVar15 = *(fdb_doc **)(auStack_d60._16_8_ + 0x20);
    pbVar5 = *(btree **)&pfStack_bf8->seqtree_opt;
    ppfStack_d88 = (fdb_doc **)0x116a9f;
    iVar4 = bcmp(pfVar15,pbVar5,(size_t)*(size_t *)auStack_d60._16_8_);
    unaff_R12 = pfStack_bf8;
    if (iVar4 != 0) goto LAB_00116c8b;
    pfVar15 = *(fdb_doc **)((long)pfVar20 + 0x38);
    pbVar5 = (btree *)pfStack_bf8->compactor_sleep_duration;
    ppfStack_d88 = (fdb_doc **)0x116abf;
    iVar4 = bcmp(pfVar15,pbVar5,*(size_t *)((long)pfVar20 + 8));
    if (iVar4 != 0) goto LAB_00116c96;
    pfVar15 = *(fdb_doc **)((long)pfVar20 + 0x40);
    pbVar5 = *(btree **)&pfStack_bf8->multi_kv_instances;
    ppfStack_d88 = (fdb_doc **)0x116adf;
    iVar4 = bcmp(pfVar15,pbVar5,*(size_t *)((long)pfVar20 + 0x10));
    if (iVar4 != 0) goto LAB_00116ca1;
    pfVar15 = (fdb_doc *)auStack_d70;
    ppfStack_d88 = (fdb_doc **)0x116af4;
    fdb_doc_free((fdb_doc *)auStack_d70._0_8_);
    pbVar5 = (btree *)0x0;
    auStack_d70._0_8_ = (fdb_doc *)0x0;
    ppfStack_d88 = (fdb_doc **)0x116b04;
    fdb_doc_free((fdb_doc *)auStack_d60._16_8_);
    ppfStack_d88 = (fdb_doc **)0x116b15;
    fdb_compact((fdb_file_handle *)auStack_d60._0_8_,"./dummy2");
    ppfStack_d88 = (fdb_doc **)0x116b38;
    fdb_doc_create((fdb_doc **)pfVar15,(void *)psStack_a90[4],*psStack_a90,(void *)0x0,0,(void *)0x0
                   ,0);
    ppfStack_d88 = (fdb_doc **)0x116b45;
    fVar3 = fdb_get_metaonly((fdb_kvs_handle *)auStack_d70._8_8_,(fdb_doc *)auStack_d70._0_8_);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00116cac;
    pfVar15 = (fdb_doc *)auStack_d70._0_8_;
    if (*(bool *)(auStack_d70._0_8_ + 0x48) == false) {
      ppfStack_d88 = (fdb_doc **)0x116b6a;
      read_doc_by_offset_test();
      pfVar15 = (fdb_doc *)auStack_d60._8_8_;
    }
    pbVar5 = (btree *)pfVar15->meta;
    pfVar20 = (fdb_doc *)psStack_a90[7];
    ppfStack_d88 = (fdb_doc **)0x116b8c;
    iVar4 = bcmp(pbVar5,pfVar20,pfVar15->metalen);
    if (iVar4 != 0) goto LAB_00116cb1;
    ppfStack_d88 = (fdb_doc **)0x116ba1;
    fVar3 = fdb_get_byoffset((fdb_kvs_handle *)auStack_d70._8_8_,pfVar15);
    if (fVar3 == FDB_RESULT_KEY_NOT_FOUND) {
      pfVar9 = (fdb_doc *)auStack_d70._0_8_;
      if (*(bool *)(auStack_d70._0_8_ + 0x48) == false) {
        ppfStack_d88 = (fdb_doc **)0x116bc7;
        read_doc_by_offset_test();
        pfVar9 = (fdb_doc *)auStack_d60._8_8_;
      }
      ppfStack_d88 = (fdb_doc **)0x116bcf;
      fdb_doc_free(pfVar9);
      auStack_d70._0_8_ = 0;
      lVar12 = 0;
      do {
        ppfStack_d88 = (fdb_doc **)0x116be7;
        fdb_doc_free(apfStack_c20[lVar12]);
        lVar12 = lVar12 + 1;
      } while (lVar12 != 100);
      ppfStack_d88 = (fdb_doc **)0x116bfa;
      fdb_kvs_close((fdb_kvs_handle *)auStack_d70._8_8_);
      ppfStack_d88 = (fdb_doc **)0x116c04;
      fdb_close((fdb_file_handle *)auStack_d60._0_8_);
      ppfStack_d88 = (fdb_doc **)0x116c09;
      fdb_shutdown();
      ppfStack_d88 = (fdb_doc **)0x116c0e;
      memleak_end();
      pcVar18 = "%s PASSED\n";
      if (read_doc_by_offset_test()::__test_pass != '\0') {
        pcVar18 = "%s FAILED\n";
      }
      ppfStack_d88 = (fdb_doc **)0x116c3f;
      fprintf(_stderr,pcVar18,"read_doc_by_offset test");
      return;
    }
  }
  else {
    ppfStack_d88 = (fdb_doc **)0x116c56;
    read_doc_by_offset_test();
LAB_00116c56:
    ppfStack_d88 = (fdb_doc **)0x116c5b;
    read_doc_by_offset_test();
LAB_00116c5b:
    ppfStack_d88 = (fdb_doc **)0x116c60;
    read_doc_by_offset_test();
LAB_00116c60:
    ppfStack_d88 = (fdb_doc **)0x116c6b;
    read_doc_by_offset_test();
LAB_00116c6b:
    ppfStack_d88 = (fdb_doc **)0x116c70;
    read_doc_by_offset_test();
LAB_00116c70:
    ppfStack_d88 = (fdb_doc **)0x116c7b;
    read_doc_by_offset_test();
LAB_00116c7b:
    ppfStack_d88 = (fdb_doc **)0x116c86;
    read_doc_by_offset_test();
LAB_00116c86:
    pfVar20 = pfVar9;
    ppfStack_d88 = (fdb_doc **)0x116c8b;
    read_doc_by_offset_test();
LAB_00116c8b:
    ppfStack_d88 = (fdb_doc **)0x116c96;
    read_doc_by_offset_test();
LAB_00116c96:
    ppfStack_d88 = (fdb_doc **)0x116ca1;
    read_doc_by_offset_test();
LAB_00116ca1:
    ppfStack_d88 = (fdb_doc **)0x116cac;
    read_doc_by_offset_test();
LAB_00116cac:
    ppfStack_d88 = (fdb_doc **)0x116cb1;
    read_doc_by_offset_test();
LAB_00116cb1:
    ppfStack_d88 = (fdb_doc **)0x116cbc;
    read_doc_by_offset_test();
  }
  ppfStack_d88 = (fdb_doc **)purge_logically_deleted_doc_test;
  read_doc_by_offset_test();
  ppfStack_1250 = (fdb_doc **)0x116ce1;
  pfStack_db0 = pfVar15;
  pfStack_da8 = unaff_R12;
  pfStack_da0 = unaff_R13;
  pbStack_d98 = pbVar5;
  pfStack_d90 = pfVar20;
  ppfStack_d88 = unaff_RBP;
  gettimeofday(&tStack_11d0,(__timezone_ptr_t)0x0);
  ppfStack_1250 = (fdb_doc **)0x116ce6;
  memleak_start();
  pfStack_1240 = (fdb_doc *)0x0;
  ppfStack_1250 = (fdb_doc **)0x116cf7;
  system("rm -rf  dummy* fdb_test_config.json > errorlog.txt");
  ppfStack_1250 = (fdb_doc **)0x116d07;
  fdb_get_default_config();
  pfVar9 = afStack_11c0;
  ppfStack_1250 = (fdb_doc **)0x116d17;
  fdb_get_default_kvs_config();
  fStack_ea8.buffercache_size = 0;
  fStack_ea8.wal_threshold = 0x400;
  fStack_ea8.flags = 1;
  fStack_ea8.purging_interval = 2;
  fStack_ea8.compaction_threshold = '\0';
  ppfVar21 = &pfStack_1230;
  ppfStack_1250 = (fdb_doc **)0x116d4c;
  fdb_open((fdb_file_handle **)ppfVar21,"./dummy1",&fStack_ea8);
  pfVar10 = (fdb_kvs_handle *)&pfStack_1238;
  ppfStack_1250 = (fdb_doc **)0x116d5f;
  fdb_kvs_open_default
            ((fdb_file_handle *)pfStack_1230,(fdb_kvs_handle **)pfVar10,(fdb_kvs_config *)pfVar9);
  ppfStack_1250 = (fdb_doc **)0x116d75;
  fVar3 = fdb_set_log_callback(pfStack_1238,logCallbackFunc,"purge_logically_deleted_doc_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    unaff_R12 = (fdb_config *)0x0;
    uVar19 = 0;
    do {
      ppfStack_1250 = (fdb_doc **)0x116d9d;
      sprintf(acStack_fa8,"key%d",uVar19 & 0xffffffff);
      ppfStack_1250 = (fdb_doc **)0x116db5;
      sprintf((char *)apfStack_10a8,"meta%d",uVar19 & 0xffffffff);
      ppfStack_1250 = (fdb_doc **)0x116dcd;
      sprintf((char *)&afStack_11c0[0].size_ondisk,"body%d",uVar19 & 0xffffffff);
      ppfVar21 = (fdb_doc **)((long)apfStack_1228 + (long)unaff_R12);
      ppfStack_1250 = (fdb_doc **)0x116ddd;
      unaff_R13 = (fdb_kvs_handle *)strlen(acStack_fa8);
      unaff_RBP = apfStack_10a8;
      ppfStack_1250 = (fdb_doc **)0x116df0;
      pfVar9 = (fdb_doc *)strlen((char *)unaff_RBP);
      ppfStack_1250 = (fdb_doc **)0x116e00;
      sVar6 = strlen((char *)&afStack_11c0[0].size_ondisk);
      ppfStack_1250 = (fdb_doc **)0x116e25;
      fdb_doc_create(ppfVar21,acStack_fa8,(size_t)unaff_R13,unaff_RBP,(size_t)pfVar9,
                     &afStack_11c0[0].size_ondisk,sVar6);
      ppfStack_1250 = (fdb_doc **)0x116e34;
      fdb_set(pfStack_1238,apfStack_1228[uVar19]);
      uVar19 = uVar19 + 1;
      unaff_R12 = (fdb_config *)((long)unaff_R12 + 8);
    } while (uVar19 != 10);
    keylen_00._0_1_ = *(uint8_t *)aStack_1200;
    keylen_00._1_1_ = *(uint8_t *)((long)aStack_1200 + 1);
    keylen_00._2_2_ = *(uint16_t *)((long)aStack_1200 + 2);
    keylen_00._4_4_ = *(uint32_t *)((long)aStack_1200 + 4);
    pfVar10 = (fdb_kvs_handle *)&pfStack_1240;
    ppfStack_1250 = (fdb_doc **)0x116e71;
    fdb_doc_create((fdb_doc **)pfVar10,(btree_kv_ops *)(aStack_1200.seqtrie)->aux,keylen_00,
                   (aStack_1200.seqtrie)->btree_leaf_kv_ops,(aStack_1200.seqtree)->root_bid,
                   (void *)0x0,0);
    ppfStack_1250 = (fdb_doc **)0x116e7e;
    fVar3 = fdb_del(pfStack_1238,pfStack_1240);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      pfVar10 = (fdb_kvs_handle *)&pfStack_1240;
      ppfStack_1250 = (fdb_doc **)0x116e93;
      fdb_doc_free(pfStack_1240);
      pfStack_1240 = (fdb_doc *)0x0;
      ppfStack_1250 = (fdb_doc **)0x116ea9;
      fdb_commit((fdb_file_handle *)pfStack_1230,'\0');
      ppfStack_1250 = (fdb_doc **)0x116eba;
      fdb_compact((fdb_file_handle *)pfStack_1230,"./dummy2");
      unaff_RBP = (fdb_doc **)0x0;
      pfVar15 = pfVar9;
      do {
        ppfStack_1250 = (fdb_doc **)0x116ee0;
        fdb_doc_create((fdb_doc **)pfVar10,apfStack_1228[(long)unaff_RBP]->key,
                       apfStack_1228[(long)unaff_RBP]->keylen,(void *)0x0,0,(void *)0x0,0);
        ppfStack_1250 = (fdb_doc **)0x116eef;
        fVar3 = fdb_get(pfStack_1238,pfStack_1240);
        pfVar9 = pfStack_1240;
        if (unaff_RBP != (fdb_doc **)0x5) {
          if (fVar3 != FDB_RESULT_SUCCESS) {
LAB_001171a3:
            ppfStack_1250 = (fdb_doc **)0x1171a8;
            purge_logically_deleted_doc_test();
            goto LAB_001171a8;
          }
          ppfVar21 = (fdb_doc **)pfStack_1240->meta;
          pfVar13 = (fdb_kvs_handle *)apfStack_1228[(long)unaff_RBP];
          unaff_R12 = (fdb_config *)pfVar13->staletree;
          ppfStack_1250 = (fdb_doc **)0x116f31;
          iVar4 = bcmp(ppfVar21,unaff_R12,pfStack_1240->metalen);
          unaff_R13 = pfVar10;
          if (iVar4 == 0) {
            ppfVar21 = (fdb_doc **)pfVar9->body;
            unaff_R12 = (fdb_config *)(pfVar13->field_6).seqtree;
            ppfStack_1250 = (fdb_doc **)0x116f50;
            iVar4 = bcmp(ppfVar21,unaff_R12,pfVar9->bodylen);
            if (iVar4 == 0) goto LAB_00116f61;
LAB_00117198:
            ppfStack_1250 = (fdb_doc **)0x1171a3;
            purge_logically_deleted_doc_test();
            pfVar15 = pfVar9;
            goto LAB_001171a3;
          }
LAB_001171ad:
          ppfStack_1250 = (fdb_doc **)0x1171b8;
          purge_logically_deleted_doc_test();
          goto LAB_001171b8;
        }
        if (fVar3 != FDB_RESULT_KEY_NOT_FOUND) {
LAB_001171a8:
          pfVar9 = pfVar15;
          ppfStack_1250 = (fdb_doc **)0x1171ad;
          purge_logically_deleted_doc_test();
          pfVar13 = pfVar10;
          unaff_R13 = (fdb_kvs_handle *)0x0;
          goto LAB_001171ad;
        }
LAB_00116f61:
        unaff_R13 = (fdb_kvs_handle *)0x0;
        ppfStack_1250 = (fdb_doc **)0x116f69;
        fdb_doc_free(pfVar9);
        pfStack_1240 = (fdb_doc *)0x0;
        ppfStack_1250 = (fdb_doc **)0x116f8e;
        fdb_doc_create((fdb_doc **)pfVar10,apfStack_1228[(long)unaff_RBP]->key,
                       apfStack_1228[(long)unaff_RBP]->keylen,(void *)0x0,0,(void *)0x0,0);
        ppfStack_1250 = (fdb_doc **)0x116f9d;
        fVar3 = fdb_get_metaonly(pfStack_1238,pfStack_1240);
        if (unaff_RBP == (fdb_doc **)0x5) {
          if ((fVar3 != FDB_RESULT_KEY_NOT_FOUND) && (fVar3 != FDB_RESULT_SUCCESS))
          goto LAB_001171e2;
        }
        else if (fVar3 != FDB_RESULT_SUCCESS) {
          ppfStack_1250 = (fdb_doc **)0x117198;
          purge_logically_deleted_doc_test();
          goto LAB_00117198;
        }
        ppfStack_1250 = (fdb_doc **)0x116fc3;
        fdb_doc_free(pfStack_1240);
        pfStack_1240 = (fdb_doc *)0x0;
        unaff_RBP = (fdb_doc **)((long)unaff_RBP + 1);
        pfVar15 = pfVar9;
      } while (unaff_RBP != (fdb_doc **)0xa);
      ppfStack_1250 = (fdb_doc **)0x116fe5;
      puts("wait for 3 seconds..");
      ppfStack_1250 = (fdb_doc **)0x116fef;
      sleep(3);
      ppfStack_1250 = (fdb_doc **)0x117000;
      fdb_compact((fdb_file_handle *)pfStack_1230,"./dummy3");
      pfVar13 = (fdb_kvs_handle *)&pfStack_1240;
      unaff_RBP = (fdb_doc **)0x0;
      do {
        unaff_R13 = (fdb_kvs_handle *)0x0;
        ppfStack_1250 = (fdb_doc **)0x11702e;
        fdb_doc_create((fdb_doc **)pfVar13,apfStack_1228[(long)unaff_RBP]->key,
                       apfStack_1228[(long)unaff_RBP]->keylen,(void *)0x0,0,(void *)0x0,0);
        ppfStack_1250 = (fdb_doc **)0x11703d;
        fVar3 = fdb_get(pfStack_1238,pfStack_1240);
        pfVar15 = pfStack_1240;
        if (unaff_RBP == (fdb_doc **)0x5) {
          if (fVar3 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001171bd;
        }
        else {
          if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001171b8;
          ppfVar21 = (fdb_doc **)pfStack_1240->meta;
          unaff_R13 = (fdb_kvs_handle *)apfStack_1228[(long)unaff_RBP];
          unaff_R12 = (fdb_config *)unaff_R13->staletree;
          ppfStack_1250 = (fdb_doc **)0x11707c;
          iVar4 = bcmp(ppfVar21,unaff_R12,pfStack_1240->metalen);
          if (iVar4 != 0) goto LAB_001171c7;
          ppfVar21 = (fdb_doc **)pfVar15->body;
          unaff_R12 = (fdb_config *)(unaff_R13->field_6).seqtree;
          ppfStack_1250 = (fdb_doc **)0x11709b;
          iVar4 = bcmp(ppfVar21,unaff_R12,pfVar15->bodylen);
          unaff_R13 = (fdb_kvs_handle *)0x0;
          if (iVar4 != 0) goto LAB_001171d7;
        }
        unaff_R13 = (fdb_kvs_handle *)0x0;
        ppfStack_1250 = (fdb_doc **)0x1170b1;
        fdb_doc_free(pfVar15);
        pfStack_1240 = (fdb_doc *)0x0;
        ppfStack_1250 = (fdb_doc **)0x1170d6;
        fdb_doc_create((fdb_doc **)pfVar13,apfStack_1228[(long)unaff_RBP]->key,
                       apfStack_1228[(long)unaff_RBP]->keylen,(void *)0x0,0,(void *)0x0,0);
        ppfStack_1250 = (fdb_doc **)0x1170e5;
        fVar3 = fdb_get_metaonly(pfStack_1238,pfStack_1240);
        if (unaff_RBP == (fdb_doc **)0x5) {
          if (fVar3 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001171c2;
        }
        else if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001171d2;
        ppfStack_1250 = (fdb_doc **)0x117107;
        fdb_doc_free(pfStack_1240);
        pfStack_1240 = (fdb_doc *)0x0;
        unaff_RBP = (fdb_doc **)((long)unaff_RBP + 1);
        pfVar9 = pfVar15;
        if (unaff_RBP == (fdb_doc **)0xa) {
          ppfStack_1250 = (fdb_doc **)0x117127;
          fdb_kvs_close(pfStack_1238);
          ppfStack_1250 = (fdb_doc **)0x117131;
          fdb_close((fdb_file_handle *)pfStack_1230);
          lVar12 = 0;
          do {
            ppfStack_1250 = (fdb_doc **)0x11713d;
            fdb_doc_free(apfStack_1228[lVar12]);
            lVar12 = lVar12 + 1;
          } while (lVar12 != 10);
          ppfStack_1250 = (fdb_doc **)0x11714b;
          fdb_shutdown();
          ppfStack_1250 = (fdb_doc **)0x117150;
          memleak_end();
          pcVar18 = "%s PASSED\n";
          if (purge_logically_deleted_doc_test()::__test_pass != '\0') {
            pcVar18 = "%s FAILED\n";
          }
          ppfStack_1250 = (fdb_doc **)0x117181;
          fprintf(_stderr,pcVar18,"purge logically deleted doc test");
          return;
        }
      } while( true );
    }
  }
  else {
LAB_001171e7:
    ppfStack_1250 = (fdb_doc **)0x1171ec;
    purge_logically_deleted_doc_test();
  }
  ppfStack_1250 = (fdb_doc **)api_wrapper_test;
  purge_logically_deleted_doc_test();
  ppfStack_16d8 = (fdb_doc **)0x11720e;
  pfStack_1278 = pfVar10;
  pfStack_1270 = unaff_R12;
  pfStack_1268 = unaff_R13;
  pfStack_1260 = pfVar9;
  ppfStack_1258 = ppfVar21;
  ppfStack_1250 = unaff_RBP;
  gettimeofday((timeval *)(auStack_16b8 + 0x10),(__timezone_ptr_t)0x0);
  ppfStack_16d8 = (fdb_doc **)0x117213;
  memleak_start();
  ppfStack_16d8 = (fdb_doc **)0x11721f;
  system("rm -rf  dummy* > errorlog.txt");
  ppfStack_16d8 = (fdb_doc **)0x11722f;
  fdb_get_default_config();
  pfVar13 = (fdb_kvs_handle *)auStack_1698;
  ppfStack_16d8 = (fdb_doc **)0x11723c;
  fdb_get_default_kvs_config();
  fStack_1478.buffercache_size = 0;
  fStack_1478.wal_threshold = 0x400;
  fStack_1478.flags = 1;
  fStack_1478.purging_interval = 0;
  fStack_1478.compaction_threshold = '\0';
  pcVar18 = auStack_16b8 + 8;
  ppfStack_16d8 = (fdb_doc **)0x117275;
  fdb_open((fdb_file_handle **)pcVar18,"./dummy1",&fStack_1478);
  pfVar10 = (fdb_kvs_handle *)&pfStack_16c8;
  ppfStack_16d8 = (fdb_doc **)0x117288;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_16b8._8_8_,(fdb_kvs_handle **)pfVar10,
             (fdb_kvs_config *)pfVar13);
  ppfStack_16d8 = (fdb_doc **)0x11729e;
  fVar3 = fdb_set_log_callback(pfStack_16c8,logCallbackFunc,"api_wrapper_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    ppfStack_16d8 = (fdb_doc **)0x1172b9;
    fVar3 = fdb_set_kv(pfStack_16c8,(void *)0x0,0,(void *)0x0,0);
    if (fVar3 != FDB_RESULT_INVALID_ARGS) goto LAB_0011750b;
    pcVar22 = auStack_1698 + 0x18;
    pcVar18 = "body%d";
    unaff_R12 = &fStack_1478 + 1;
    unaff_RBP = (fdb_doc **)0x0;
    do {
      ppfStack_16d8 = (fdb_doc **)0x1172eb;
      sprintf(pcVar22,"key%d",unaff_RBP);
      ppfStack_16d8 = (fdb_doc **)0x1172fa;
      sprintf((char *)unaff_R12,"body%d",unaff_RBP);
      unaff_R13 = pfStack_16c8;
      ppfStack_16d8 = (fdb_doc **)0x117307;
      pfVar10 = (fdb_kvs_handle *)strlen(pcVar22);
      ppfStack_16d8 = (fdb_doc **)0x117312;
      sVar6 = strlen((char *)unaff_R12);
      ppfStack_16d8 = (fdb_doc **)0x117326;
      fVar3 = fdb_set_kv(unaff_R13,pcVar22,(size_t)pfVar10,unaff_R12,sVar6);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        ppfStack_16d8 = (fdb_doc **)0x1174ec;
        api_wrapper_test();
        goto LAB_001174ec;
      }
      uVar16 = (int)unaff_RBP + 1;
      unaff_RBP = (fdb_doc **)(ulong)uVar16;
    } while (uVar16 != 10);
    pfVar10 = (fdb_kvs_handle *)(auStack_1698 + 0x18);
    ppfStack_16d8 = (fdb_doc **)0x117350;
    sprintf((char *)pfVar10,"key%d",5);
    pfVar13 = pfStack_16c8;
    ppfStack_16d8 = (fdb_doc **)0x11735d;
    sVar6 = strlen((char *)pfVar10);
    ppfStack_16d8 = (fdb_doc **)0x11736b;
    fVar3 = fdb_del_kv(pfVar13,pfVar10,sVar6);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00117510;
    ppfStack_16d8 = (fdb_doc **)0x117381;
    fVar3 = fdb_del_kv(pfStack_16c8,(void *)0x0,0);
    if (fVar3 != FDB_RESULT_INVALID_ARGS) goto LAB_00117515;
    pfVar13 = (fdb_kvs_handle *)(auStack_1698 + 0x18);
    pcVar18 = (char *)&pfStack_16c0;
    unaff_R12 = (fdb_config *)auStack_16b8;
    unaff_RBP = apfStack_1580;
    unaff_R13 = (fdb_kvs_handle *)0x0;
    do {
      ppfStack_16d8 = (fdb_doc **)0x1173b8;
      sprintf((char *)pfVar13,"key%d",unaff_R13);
      pfVar10 = pfStack_16c8;
      ppfStack_16d8 = (fdb_doc **)0x1173c5;
      sVar6 = strlen((char *)pfVar13);
      ppfStack_16d8 = (fdb_doc **)0x1173d9;
      fVar3 = fdb_get_kv(pfVar10,pfVar13,sVar6,(void **)pcVar18,(size_t *)unaff_R12);
      if ((int)unaff_R13 == 5) {
        if (fVar3 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_00117501;
      }
      else {
        if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001174fc;
        ppfStack_16d8 = (fdb_doc **)0x117405;
        sprintf((char *)unaff_RBP,"body%d",unaff_R13);
        pfVar10 = pfStack_16c0;
        ppfStack_16d8 = (fdb_doc **)0x11741a;
        iVar4 = bcmp(pfStack_16c0,unaff_RBP,auStack_16b8._0_8_);
        if (iVar4 != 0) goto LAB_001174ec;
        ppfStack_16d8 = (fdb_doc **)0x11742a;
        fdb_free_block(pfVar10);
      }
      uVar16 = (int)unaff_R13 + 1;
      unaff_R13 = (fdb_kvs_handle *)(ulong)uVar16;
    } while (uVar16 != 10);
    ppfStack_16d8 = (fdb_doc **)0x11744f;
    fVar3 = fdb_get_kv(pfStack_16c8,(void *)0x0,0,&pfStack_16c0,(size_t *)auStack_16b8);
    handle = pfStack_16c8;
    if (fVar3 != FDB_RESULT_INVALID_ARGS) goto LAB_0011751a;
    pfVar13 = (fdb_kvs_handle *)(auStack_1698 + 0x18);
    ppfStack_16d8 = (fdb_doc **)0x11746a;
    sVar6 = strlen((char *)pfVar13);
    ppfStack_16d8 = (fdb_doc **)0x11747d;
    fVar3 = fdb_get_kv(handle,pfVar13,sVar6,(void **)0x0,(size_t *)0x0);
    if (fVar3 == FDB_RESULT_INVALID_ARGS) {
      ppfStack_16d8 = (fdb_doc **)0x117490;
      fdb_kvs_close(pfStack_16c8);
      ppfStack_16d8 = (fdb_doc **)0x11749a;
      fdb_close((fdb_file_handle *)auStack_16b8._8_8_);
      ppfStack_16d8 = (fdb_doc **)0x11749f;
      fdb_shutdown();
      ppfStack_16d8 = (fdb_doc **)0x1174a4;
      memleak_end();
      pcVar18 = "%s PASSED\n";
      if (api_wrapper_test()::__test_pass != '\0') {
        pcVar18 = "%s FAILED\n";
      }
      ppfStack_16d8 = (fdb_doc **)0x1174d5;
      fprintf(_stderr,pcVar18,"API wrapper test");
      return;
    }
  }
  else {
LAB_00117506:
    ppfStack_16d8 = (fdb_doc **)0x11750b;
    api_wrapper_test();
LAB_0011750b:
    ppfStack_16d8 = (fdb_doc **)0x117510;
    api_wrapper_test();
LAB_00117510:
    ppfStack_16d8 = (fdb_doc **)0x117515;
    api_wrapper_test();
LAB_00117515:
    ppfStack_16d8 = (fdb_doc **)0x11751a;
    api_wrapper_test();
LAB_0011751a:
    handle = pfVar10;
    ppfStack_16d8 = (fdb_doc **)0x11751f;
    api_wrapper_test();
  }
  ppfStack_16d8 = (fdb_doc **)flush_before_commit_test;
  api_wrapper_test();
  ppfStack_1c60 = (fdb_doc **)0x117544;
  pfStack_1700 = handle;
  pfStack_16f8 = unaff_R12;
  pfStack_16f0 = unaff_R13;
  pfStack_16e8 = pfVar13;
  ppfStack_16e0 = (fdb_kvs_handle **)pcVar18;
  ppfStack_16d8 = unaff_RBP;
  gettimeofday(&tStack_1b30,(__timezone_ptr_t)0x0);
  ppfStack_1c60 = (fdb_doc **)0x117549;
  memleak_start();
  ppfStack_1c60 = (fdb_doc **)0x117555;
  system("rm -rf  dummy* > errorlog.txt");
  ppfStack_1c60 = (fdb_doc **)0x117565;
  fdb_get_default_config();
  ppfStack_1c60 = (fdb_doc **)0x117575;
  fdb_get_default_kvs_config();
  fStack_1a00.buffercache_size = 0;
  fStack_1a00.wal_threshold = 5;
  fStack_1a00.flags = 1;
  fStack_1a00.purging_interval = 0;
  fStack_1a00.compaction_threshold = '\0';
  fStack_1a00.wal_flush_before_commit = true;
  ppfStack_1c60 = (fdb_doc **)0x1175b9;
  fdb_open(&pfStack_1c30,"dummy1",&fStack_1a00);
  ppfStack_1c60 = (fdb_doc **)0x1175cc;
  fdb_open(&pfStack_1c48,"dummy1",&fStack_1a00);
  ppfStack_1c60 = (fdb_doc **)0x1175dd;
  fdb_kvs_open_default(pfStack_1c30,&pfStack_1c38,&fStack_1b20);
  ppfStack_1c60 = (fdb_doc **)0x1175f1;
  fdb_kvs_open_default(pfStack_1c48,&pfStack_1c40,&fStack_1b20);
  ppfStack_1c60 = (fdb_doc **)0x117607;
  fVar3 = fdb_set_log_callback(pfStack_1c40,logCallbackFunc,"flush_before_commit_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    ppfVar21 = apfStack_1c28;
    uVar19 = 0;
    do {
      ppfStack_1c60 = (fdb_doc **)0x117633;
      sprintf(acStack_1b08,"key%d",uVar19 & 0xffffffff);
      ppfStack_1c60 = (fdb_doc **)0x11764f;
      sprintf(acStack_1808,"meta%d",uVar19 & 0xffffffff);
      ppfStack_1c60 = (fdb_doc **)0x11766b;
      sprintf(acStack_1908,"body%d",uVar19 & 0xffffffff);
      ppfStack_1c60 = (fdb_doc **)0x117673;
      sVar6 = strlen(acStack_1b08);
      ppfStack_1c60 = (fdb_doc **)0x11767e;
      sVar7 = strlen(acStack_1808);
      ppfStack_1c60 = (fdb_doc **)0x117689;
      sVar8 = strlen(acStack_1908);
      ppfStack_1c60 = (fdb_doc **)0x1176a9;
      fdb_doc_create(ppfVar21,acStack_1b08,sVar6,acStack_1808,sVar7,acStack_1908,sVar8);
      uVar19 = uVar19 + 1;
      ppfVar21 = ppfVar21 + 1;
    } while (uVar19 != 0x1e);
    ppfStack_1c60 = (fdb_doc **)0x1176c9;
    fdb_begin_transaction(pfStack_1c48,'\x02');
    ppfStack_1c60 = (fdb_doc **)0x1176d8;
    fdb_set(pfStack_1c38,apfStack_1c28[0]);
    ppfStack_1c60 = (fdb_doc **)0x1176e7;
    fdb_set(pfStack_1c38,apfStack_1c28[1]);
    lVar12 = 0;
    ppfStack_1c60 = (fdb_doc **)0x1176f5;
    fdb_commit(pfStack_1c30,'\0');
    ppfStack_1c60 = (fdb_doc **)0x117704;
    fdb_set(pfStack_1c40,apfStack_1c28[0]);
    ppfStack_1c60 = (fdb_doc **)0x117713;
    fdb_set(pfStack_1c40,apfStack_1c28[1]);
    ppfStack_1c60 = (fdb_doc **)0x11771f;
    fdb_end_transaction(pfStack_1c48,'\0');
    ppfStack_1c60 = (fdb_doc **)0x11772e;
    fdb_commit(pfStack_1c30,'\x01');
    ppfStack_1c60 = (fdb_doc **)0x11773d;
    fdb_begin_transaction(pfStack_1c48,'\x02');
    ppfStack_1c60 = (fdb_doc **)0x11774c;
    fdb_set(pfStack_1c40,apfStack_1c28[0]);
    ppfStack_1c60 = (fdb_doc **)0x11775b;
    fdb_set(pfStack_1c40,apfStack_1c28[1]);
    ppfStack_1c60 = (fdb_doc **)0x117767;
    fdb_end_transaction(pfStack_1c48,'\0');
    ppfStack_1c60 = (fdb_doc **)0x117776;
    fdb_set(pfStack_1c38,apfStack_1c28[0]);
    ppfStack_1c60 = (fdb_doc **)0x117785;
    fdb_set(pfStack_1c38,apfStack_1c28[1]);
    ppfStack_1c60 = (fdb_doc **)0x117791;
    fdb_commit(pfStack_1c30,'\0');
    ppfStack_1c60 = (fdb_doc **)0x1177a0;
    fdb_commit(pfStack_1c30,'\x01');
    ppfStack_1c60 = (fdb_doc **)0x1177af;
    fdb_begin_transaction(pfStack_1c48,'\x02');
    ppfStack_1c60 = (fdb_doc **)0x1177be;
    fdb_set(pfStack_1c40,apfStack_1c28[0]);
    ppfStack_1c60 = (fdb_doc **)0x1177cd;
    fdb_set(pfStack_1c40,apfStack_1c28[1]);
    ppfStack_1c60 = (fdb_doc **)0x1177dc;
    fdb_set(pfStack_1c38,apfStack_1c28[0]);
    ppfStack_1c60 = (fdb_doc **)0x1177eb;
    fdb_set(pfStack_1c38,apfStack_1c28[1]);
    ppfStack_1c60 = (fdb_doc **)0x1177f7;
    fdb_commit(pfStack_1c30,'\0');
    ppfStack_1c60 = (fdb_doc **)0x117803;
    fdb_end_transaction(pfStack_1c48,'\0');
    ppfStack_1c60 = (fdb_doc **)0x117812;
    fdb_commit(pfStack_1c30,'\x01');
    ppfStack_1c60 = (fdb_doc **)0x117821;
    fdb_begin_transaction(pfStack_1c48,'\x02');
    ppfStack_1c60 = (fdb_doc **)0x117830;
    fdb_set(pfStack_1c38,apfStack_1c28[0]);
    ppfStack_1c60 = (fdb_doc **)0x11783f;
    fdb_set(pfStack_1c38,apfStack_1c28[1]);
    ppfStack_1c60 = (fdb_doc **)0x11784e;
    fdb_set(pfStack_1c40,apfStack_1c28[0]);
    ppfStack_1c60 = (fdb_doc **)0x11785d;
    fdb_set(pfStack_1c40,apfStack_1c28[1]);
    ppfStack_1c60 = (fdb_doc **)0x117869;
    fdb_end_transaction(pfStack_1c48,'\0');
    ppfStack_1c60 = (fdb_doc **)0x117875;
    fdb_commit(pfStack_1c30,'\0');
    ppfStack_1c60 = (fdb_doc **)0x117884;
    fdb_commit(pfStack_1c30,'\x01');
    ppfStack_1c60 = (fdb_doc **)0x117893;
    fdb_begin_transaction(pfStack_1c48,'\x02');
    do {
      ppfStack_1c60 = (fdb_doc **)0x1178a2;
      fdb_set(pfStack_1c40,apfStack_1c28[lVar12]);
      lVar12 = lVar12 + 1;
    } while (lVar12 != 10);
    lVar12 = 0;
    do {
      ppfStack_1c60 = (fdb_doc **)0x1178bf;
      fdb_set(pfStack_1c38,apfStack_1c28[lVar12 + 10]);
      lVar12 = lVar12 + 1;
    } while (lVar12 != 10);
    ppfStack_1c60 = (fdb_doc **)0x1178d9;
    fdb_compact(pfStack_1c30,"dummy2");
    lVar12 = 0;
    do {
      ppfStack_1c60 = (fdb_doc **)0x1178ed;
      fdb_set(pfStack_1c40,apfStack_1c28[lVar12 + 0x14]);
      lVar12 = lVar12 + 1;
    } while (lVar12 != 5);
    lVar12 = 0;
    ppfStack_1c60 = (fdb_doc **)0x117904;
    fdb_end_transaction(pfStack_1c48,'\0');
    do {
      ppfStack_1c60 = (fdb_doc **)0x117916;
      fdb_set(pfStack_1c38,apfStack_1c28[lVar12 + 0x19]);
      lVar12 = lVar12 + 1;
    } while (lVar12 != 5);
    ppfStack_1c60 = (fdb_doc **)0x117929;
    fdb_close(pfStack_1c30);
    ppfStack_1c60 = (fdb_doc **)0x117933;
    fdb_close(pfStack_1c48);
    lVar12 = 0;
    do {
      ppfStack_1c60 = (fdb_doc **)0x11793f;
      fdb_doc_free(apfStack_1c28[lVar12]);
      lVar12 = lVar12 + 1;
    } while (lVar12 != 0x1e);
    ppfStack_1c60 = (fdb_doc **)0x11794d;
    fdb_shutdown();
    ppfStack_1c60 = (fdb_doc **)0x117952;
    memleak_end();
    pcVar18 = "%s PASSED\n";
    if (flush_before_commit_test()::__test_pass != '\0') {
      pcVar18 = "%s FAILED\n";
    }
    ppfStack_1c60 = (fdb_doc **)0x117983;
    fprintf(_stderr,pcVar18,"flush before commit test");
    return;
  }
  ppfStack_1c60 = (fdb_doc **)flush_before_commit_multi_writers_test;
  flush_before_commit_test();
  pcStack_1c68 = "dummy1";
  pfStack_2138 = (fdb_encryption_key *)0x1179bd;
  pfStack_1c88 = &fStack_1b20;
  ppfStack_1c80 = &pfStack_1c30;
  ppfStack_1c78 = &pfStack_1c48;
  ppfStack_1c70 = &pfStack_1c40;
  ppfStack_1c60 = unaff_RBP;
  gettimeofday(&tStack_2090,(__timezone_ptr_t)0x0);
  pfStack_2138 = (fdb_encryption_key *)0x1179c2;
  memleak_start();
  pfStack_2128 = (fdb_doc *)0x0;
  pfStack_2138 = (fdb_encryption_key *)0x1179d3;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_2138 = (fdb_encryption_key *)0x1179e3;
  fdb_get_default_config();
  fStack_1d80.buffercache_size = 0;
  fStack_1d80.wal_threshold = 8;
  fStack_1d80.flags = 1;
  fStack_1d80.purging_interval = 0;
  fStack_1d80.compaction_threshold = '\0';
  fStack_1d80.wal_flush_before_commit = true;
  pfStack_2138 = (fdb_encryption_key *)0x117a15;
  fdb_get_default_kvs_config();
  pfStack_2138 = (fdb_encryption_key *)0x117a2c;
  fdb_open(&pfStack_2110,"dummy1",&fStack_1d80);
  pfStack_2138 = (fdb_encryption_key *)0x117a3e;
  fdb_kvs_open(pfStack_2110,&pfStack_2120,(char *)0x0,&fStack_20a8);
  lVar12 = 0;
  uVar19 = 0;
  do {
    ppfVar11 = &fStack_2080.bub_ctx.handle;
    pfStack_2138 = (fdb_encryption_key *)0x117a5e;
    sprintf((char *)ppfVar11,"key%d",uVar19 & 0xffffffff);
    pfStack_2138 = (fdb_encryption_key *)0x117a76;
    sprintf((char *)&fStack_2080.config.encryption_key,"meta%d",uVar19 & 0xffffffff);
    pfStack_2138 = (fdb_encryption_key *)0x117a8e;
    sprintf((char *)&fStack_2080,"body%d",uVar19 & 0xffffffff);
    pfStack_2138 = (fdb_encryption_key *)0x117a9e;
    sVar6 = strlen((char *)ppfVar11);
    pfVar17 = &fStack_2080.config.encryption_key;
    pfStack_2138 = (fdb_encryption_key *)0x117ab1;
    sVar7 = strlen((char *)pfVar17);
    pfStack_2138 = (fdb_encryption_key *)0x117ac1;
    sVar8 = strlen((char *)&fStack_2080);
    pfStack_2138 = (fdb_encryption_key *)0x117ae6;
    fdb_doc_create((fdb_doc **)((long)apfStack_2100 + lVar12),&fStack_2080.bub_ctx.handle,sVar6,
                   pfVar17,sVar7,&fStack_2080,sVar8);
    pfStack_2138 = (fdb_encryption_key *)0x117af5;
    fdb_set(pfStack_2120,apfStack_2100[uVar19]);
    uVar19 = uVar19 + 1;
    lVar12 = lVar12 + 8;
  } while (uVar19 != 10);
  pfStack_2138 = (fdb_encryption_key *)0x117b15;
  fdb_commit(pfStack_2110,'\x01');
  pfStack_2138 = (fdb_encryption_key *)0x117b31;
  fdb_open(&pfStack_2108,"dummy1",&fStack_1d80);
  pfStack_2138 = (fdb_encryption_key *)0x117b48;
  fdb_kvs_open(pfStack_2108,&pfStack_2118,(char *)0x0,&fStack_20a8);
  pfVar17 = &fStack_2080.config.encryption_key;
  lVar12 = 0;
  uVar19 = 0;
  do {
    pfStack_2138 = (fdb_encryption_key *)0x117b71;
    sprintf((char *)pfVar17,"meta2%d",uVar19 & 0xffffffff);
    pfStack_2138 = (fdb_encryption_key *)0x117b85;
    sprintf((char *)&fStack_2080,"body2%d(db2)",uVar19 & 0xffffffff);
    pfStack_2138 = (fdb_encryption_key *)0x117b95;
    sVar6 = strlen((char *)pfVar17);
    pfStack_2138 = (fdb_encryption_key *)0x117ba0;
    sVar7 = strlen((char *)&fStack_2080);
    pfStack_2138 = (fdb_encryption_key *)0x117bb4;
    fdb_doc_update((fdb_doc **)((long)apfStack_2100 + lVar12),pfVar17,sVar6,&fStack_2080,sVar7);
    pfStack_2138 = (fdb_encryption_key *)0x117bc3;
    fdb_set(pfStack_2118,apfStack_2100[uVar19]);
    uVar19 = uVar19 + 1;
    lVar12 = lVar12 + 8;
  } while (uVar19 != 5);
  uVar19 = 5;
  lVar12 = 0x28;
  pfVar17 = &fStack_2080.config.encryption_key;
  pfVar10 = &fStack_2080;
  do {
    pfStack_2138 = (fdb_encryption_key *)0x117c05;
    sprintf((char *)pfVar17,"meta2%d",uVar19 & 0xffffffff);
    pfStack_2138 = (fdb_encryption_key *)0x117c14;
    sprintf((char *)pfVar10,"body2%d(db1)",uVar19 & 0xffffffff);
    pfStack_2138 = (fdb_encryption_key *)0x117c24;
    sVar6 = strlen((char *)pfVar17);
    pfStack_2138 = (fdb_encryption_key *)0x117c2f;
    sVar7 = strlen((char *)pfVar10);
    pfStack_2138 = (fdb_encryption_key *)0x117c4a;
    fdb_doc_update((fdb_doc **)((long)apfStack_2100 + lVar12),pfVar17,sVar6,pfVar10,sVar7);
    pfStack_2138 = (fdb_encryption_key *)0x117c59;
    fdb_set(pfStack_2120,apfStack_2100[uVar19]);
    uVar19 = uVar19 + 1;
    lVar12 = lVar12 + 8;
  } while (uVar19 != 10);
  ppfVar11 = &fStack_2080.bub_ctx.handle;
  pfVar17 = &fStack_2080.config.encryption_key;
  uVar19 = 0;
  do {
    pcVar18 = "body2%d(db1)";
    pfStack_2138 = (fdb_encryption_key *)0x117c93;
    sprintf((char *)ppfVar11,"key%d",uVar19);
    pfStack_2138 = (fdb_encryption_key *)0x117ca6;
    sprintf((char *)pfVar17,"meta2%d",uVar19);
    if ((uint)uVar19 < 5) {
      pcVar18 = "body2%d(db2)";
    }
    pfStack_2138 = (fdb_encryption_key *)0x117cc3;
    sprintf((char *)&fStack_2080,pcVar18,uVar19);
    pfStack_2138 = (fdb_encryption_key *)0x117ccb;
    sVar6 = strlen((char *)ppfVar11);
    pfStack_2138 = (fdb_encryption_key *)0x117ceb;
    fdb_doc_create(&pfStack_2128,ppfVar11,sVar6,(void *)0x0,0,(void *)0x0,0);
    pfStack_2138 = (fdb_encryption_key *)0x117cfa;
    fVar3 = fdb_get(pfStack_2120,pfStack_2128);
    pfVar9 = pfStack_2128;
    if (fVar3 != FDB_RESULT_SUCCESS) {
LAB_00118008:
      pfStack_2138 = (fdb_encryption_key *)0x11800d;
      flush_before_commit_multi_writers_test();
LAB_0011800d:
      pfStack_2138 = (fdb_encryption_key *)0x118012;
      flush_before_commit_multi_writers_test();
      pfVar9 = (fdb_doc *)pcVar18;
LAB_00118012:
      pfStack_2138 = (fdb_encryption_key *)0x118022;
      flush_before_commit_multi_writers_test();
LAB_00118022:
      pfStack_2138 = (fdb_encryption_key *)0x118032;
      flush_before_commit_multi_writers_test();
LAB_00118032:
      pfStack_2138 = (fdb_encryption_key *)0x118042;
      flush_before_commit_multi_writers_test();
      goto LAB_00118042;
    }
    pfVar10 = (fdb_kvs_handle *)pfStack_2128->meta;
    pfStack_2138 = (fdb_encryption_key *)0x117d1a;
    iVar4 = bcmp(pfVar17,pfVar10,pfStack_2128->metalen);
    if (iVar4 != 0) {
      pfStack_2138 = (fdb_encryption_key *)0x118008;
      flush_before_commit_multi_writers_test();
      pcVar18 = (char *)pfVar9;
      goto LAB_00118008;
    }
    pfVar10 = (fdb_kvs_handle *)pfVar9->body;
    pfStack_2138 = (fdb_encryption_key *)0x117d35;
    iVar4 = bcmp(&fStack_2080,pfVar10,pfVar9->bodylen);
    if (iVar4 != 0) goto LAB_00118012;
    pfStack_2138 = (fdb_encryption_key *)0x117d45;
    fdb_doc_free(pfVar9);
    pcVar18 = (char *)0x0;
    pfStack_2128 = (fdb_doc *)0x0;
    pfStack_2138 = (fdb_encryption_key *)0x117d55;
    sVar6 = strlen((char *)ppfVar11);
    pfStack_2138 = (fdb_encryption_key *)0x117d71;
    fdb_doc_create(&pfStack_2128,ppfVar11,sVar6,(void *)0x0,0,(void *)0x0,0);
    pfStack_2138 = (fdb_encryption_key *)0x117d80;
    fVar3 = fdb_get(pfStack_2118,pfStack_2128);
    pfVar9 = pfStack_2128;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011800d;
    pfVar10 = (fdb_kvs_handle *)pfStack_2128->meta;
    pfStack_2138 = (fdb_encryption_key *)0x117da0;
    iVar4 = bcmp(pfVar17,pfVar10,pfStack_2128->metalen);
    if (iVar4 != 0) goto LAB_00118032;
    pfVar10 = (fdb_kvs_handle *)pfVar9->body;
    pfStack_2138 = (fdb_encryption_key *)0x117dbb;
    iVar4 = bcmp(&fStack_2080,pfVar10,pfVar9->bodylen);
    if (iVar4 != 0) goto LAB_00118022;
    pfStack_2138 = (fdb_encryption_key *)0x117dcb;
    fdb_doc_free(pfVar9);
    pfStack_2128 = (fdb_doc *)0x0;
    uVar16 = (uint)uVar19 + 1;
    uVar19 = (ulong)uVar16;
  } while (uVar16 != 10);
  pfStack_2138 = (fdb_encryption_key *)0x117df2;
  fdb_commit(pfStack_2110,'\0');
  pfStack_2138 = (fdb_encryption_key *)0x117dfe;
  fdb_commit(pfStack_2108,'\0');
  ppfVar11 = &fStack_2080.bub_ctx.handle;
  pfVar17 = &fStack_2080.config.encryption_key;
  uVar19 = 0;
  while( true ) {
    pfStack_2138 = (fdb_encryption_key *)0x117e32;
    sprintf((char *)ppfVar11,"key%d",uVar19);
    pfStack_2138 = (fdb_encryption_key *)0x117e45;
    sprintf((char *)pfVar17,"meta2%d",uVar19);
    pcVar18 = "body2%d(db1)";
    if ((uint)uVar19 < 5) {
      pcVar18 = "body2%d(db2)";
    }
    pfStack_2138 = (fdb_encryption_key *)0x117e5f;
    sprintf((char *)&fStack_2080,pcVar18,uVar19);
    pfStack_2138 = (fdb_encryption_key *)0x117e67;
    sVar6 = strlen((char *)ppfVar11);
    pfStack_2138 = (fdb_encryption_key *)0x117e87;
    fdb_doc_create(&pfStack_2128,ppfVar11,sVar6,(void *)0x0,0,(void *)0x0,0);
    pfStack_2138 = (fdb_encryption_key *)0x117e96;
    fVar3 = fdb_get(pfStack_2120,pfStack_2128);
    pfVar9 = pfStack_2128;
    pfVar15 = (fdb_doc *)"body2%d(db2)";
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    pfVar10 = (fdb_kvs_handle *)pfStack_2128->meta;
    pfStack_2138 = (fdb_encryption_key *)0x117eb6;
    iVar4 = bcmp(pfVar17,pfVar10,pfStack_2128->metalen);
    if (iVar4 != 0) goto LAB_00118042;
    pfVar10 = (fdb_kvs_handle *)pfVar9->body;
    pfStack_2138 = (fdb_encryption_key *)0x117ed1;
    iVar4 = bcmp(&fStack_2080,pfVar10,pfVar9->bodylen);
    if (iVar4 != 0) goto LAB_0011805c;
    pfStack_2138 = (fdb_encryption_key *)0x117ee1;
    fdb_doc_free(pfVar9);
    pfVar15 = (fdb_doc *)0x0;
    pfStack_2128 = (fdb_doc *)0x0;
    pfStack_2138 = (fdb_encryption_key *)0x117ef1;
    sVar6 = strlen((char *)ppfVar11);
    pfStack_2138 = (fdb_encryption_key *)0x117f0d;
    fdb_doc_create(&pfStack_2128,ppfVar11,sVar6,(void *)0x0,0,(void *)0x0,0);
    pfStack_2138 = (fdb_encryption_key *)0x117f1c;
    fVar3 = fdb_get(pfStack_2118,pfStack_2128);
    pfVar9 = pfStack_2128;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118057;
    pfVar10 = (fdb_kvs_handle *)pfStack_2128->meta;
    pfStack_2138 = (fdb_encryption_key *)0x117f3c;
    iVar4 = bcmp(pfVar17,pfVar10,pfStack_2128->metalen);
    if (iVar4 != 0) goto LAB_0011807c;
    pfVar10 = (fdb_kvs_handle *)pfVar9->body;
    pfStack_2138 = (fdb_encryption_key *)0x117f57;
    iVar4 = bcmp(&fStack_2080,pfVar10,pfVar9->bodylen);
    if (iVar4 != 0) goto LAB_0011806c;
    pfStack_2138 = (fdb_encryption_key *)0x117f67;
    fdb_doc_free(pfVar9);
    pfStack_2128 = (fdb_doc *)0x0;
    uVar16 = (uint)uVar19 + 1;
    uVar19 = (ulong)uVar16;
    if (uVar16 == 10) {
      pfStack_2138 = (fdb_encryption_key *)0x117f8c;
      fdb_close(pfStack_2110);
      pfStack_2138 = (fdb_encryption_key *)0x117f96;
      fdb_close(pfStack_2108);
      lVar12 = 0;
      do {
        pfStack_2138 = (fdb_encryption_key *)0x117fa2;
        fdb_doc_free(apfStack_2100[lVar12]);
        lVar12 = lVar12 + 1;
      } while (lVar12 != 10);
      pfStack_2138 = (fdb_encryption_key *)0x117fb0;
      fdb_shutdown();
      pfStack_2138 = (fdb_encryption_key *)0x117fb5;
      memleak_end();
      pcVar18 = "%s PASSED\n";
      if (flush_before_commit_multi_writers_test()::__test_pass != '\0') {
        pcVar18 = "%s FAILED\n";
      }
      pfStack_2138 = (fdb_encryption_key *)0x117fe6;
      fprintf(_stderr,pcVar18,"flush before commit with multi writers test");
      return;
    }
  }
LAB_00118052:
  pfStack_2138 = (fdb_encryption_key *)0x118057;
  flush_before_commit_multi_writers_test();
LAB_00118057:
  pfStack_2138 = (fdb_encryption_key *)0x11805c;
  flush_before_commit_multi_writers_test();
  pfVar9 = pfVar15;
LAB_0011805c:
  pfStack_2138 = (fdb_encryption_key *)0x11806c;
  flush_before_commit_multi_writers_test();
LAB_0011806c:
  pfStack_2138 = (fdb_encryption_key *)0x11807c;
  flush_before_commit_multi_writers_test();
LAB_0011807c:
  pfVar13 = &fStack_2080;
  ppfVar11 = &fStack_2080.bub_ctx.handle;
  pfVar17 = &fStack_2080.config.encryption_key;
  pfStack_2138 = (fdb_encryption_key *)auto_commit_test;
  flush_before_commit_multi_writers_test();
  pfStack_24b0 = (fdb_encryption_key *)0x1180a9;
  uStack_2160 = uVar19;
  ppfStack_2158 = ppfVar11;
  pfStack_2150 = pfVar10;
  pfStack_2148 = pfVar9;
  pfStack_2140 = pfVar13;
  pfStack_2138 = pfVar17;
  gettimeofday((timeval *)(auStack_2488 + 0x20),(__timezone_ptr_t)0x0);
  pfStack_24b0 = (fdb_encryption_key *)0x1180ae;
  memleak_start();
  pfStack_24b0 = (fdb_encryption_key *)0x1180ba;
  system("rm -rf  dummy* > errorlog.txt");
  pfVar14 = &fStack_2258;
  pfStack_24b0 = (fdb_encryption_key *)0x1180ca;
  fdb_get_default_config();
  pfStack_24b0 = (fdb_encryption_key *)0x1180d4;
  fdb_get_default_kvs_config();
  fStack_2258.buffercache_size = 0;
  fStack_2258.wal_threshold = 0x1000;
  fStack_2258.flags = 1;
  fStack_2258.durability_opt = '\x02';
  fStack_2258.auto_commit = true;
  pfStack_24b0 = (fdb_encryption_key *)0x118107;
  fVar3 = fdb_open(&pfStack_2498,"dummy1",pfVar14);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pfStack_24b0 = (fdb_encryption_key *)0x118123;
    fVar3 = fdb_kvs_open_default(pfStack_2498,&pfStack_24a0,(fdb_kvs_config *)(auStack_2488 + 8));
    pcVar18 = (char *)pfVar13;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001183c1;
    pcVar18 = "body%d";
    pfVar17 = (fdb_encryption_key *)0x0;
    do {
      pfStack_24b0 = (fdb_encryption_key *)0x118154;
      sprintf((char *)afStack_2358,"key%d",pfVar17);
      pfStack_24b0 = (fdb_encryption_key *)0x118163;
      sprintf((char *)apfStack_2458,"body%d",pfVar17);
      pfVar10 = pfStack_24a0;
      pfStack_24b0 = (fdb_encryption_key *)0x118170;
      sVar6 = strlen((char *)afStack_2358);
      pfVar14 = (fdb_config *)(sVar6 + 1);
      pfStack_24b0 = (fdb_encryption_key *)0x11817c;
      sVar6 = strlen((char *)apfStack_2458);
      pfStack_24b0 = (fdb_encryption_key *)0x118191;
      fVar3 = fdb_set_kv(pfVar10,afStack_2358,(size_t)pfVar14,apfStack_2458,sVar6 + 1);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pfStack_24b0 = (fdb_encryption_key *)0x118398;
        auto_commit_test();
        goto LAB_00118398;
      }
      uVar16 = (int)pfVar17 + 1;
      pfVar17 = (fdb_encryption_key *)(ulong)uVar16;
    } while (uVar16 != 5000);
    pfVar9 = afStack_2358;
    ppfVar11 = apfStack_2458;
    pfVar10 = (fdb_kvs_handle *)auStack_2488;
    pfVar17 = (fdb_encryption_key *)auStack_2490;
    pfVar14 = (fdb_config *)0x0;
    do {
      pfStack_24b0 = (fdb_encryption_key *)0x1181cf;
      sprintf((char *)pfVar9,"key%d",pfVar14);
      pfStack_24b0 = (fdb_encryption_key *)0x1181e2;
      sprintf((char *)ppfVar11,"body%d",pfVar14);
      pfVar13 = pfStack_24a0;
      pfStack_24b0 = (fdb_encryption_key *)0x1181ef;
      sVar6 = strlen((char *)pfVar9);
      pfStack_24b0 = (fdb_encryption_key *)0x118204;
      fVar3 = fdb_get_kv(pfVar13,pfVar9,sVar6 + 1,(void **)pfVar10,(size_t *)pfVar17);
      pcVar18 = (char *)auStack_2488._0_8_;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001183a5;
      pfStack_24b0 = (fdb_encryption_key *)0x118221;
      iVar4 = bcmp((void *)auStack_2488._0_8_,ppfVar11,(size_t)auStack_2490);
      if (iVar4 != 0) goto LAB_00118398;
      pfStack_24b0 = (fdb_encryption_key *)0x118231;
      fdb_free_block(pcVar18);
      uVar16 = (int)pfVar14 + 1;
      pfVar14 = (fdb_config *)(ulong)uVar16;
    } while (uVar16 != 5000);
    pfStack_24b0 = (fdb_encryption_key *)0x118245;
    fVar3 = fdb_kvs_close(pfStack_24a0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001183c6;
    pfStack_24b0 = (fdb_encryption_key *)0x118257;
    fVar3 = fdb_close(pfStack_2498);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001183cb;
    pfStack_24b0 = (fdb_encryption_key *)0x118278;
    fVar3 = fdb_open(&pfStack_2498,"dummy1",&fStack_2258);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001183d0;
    pfStack_24b0 = (fdb_encryption_key *)0x118294;
    fVar3 = fdb_kvs_open_default(pfStack_2498,&pfStack_24a0,(fdb_kvs_config *)(auStack_2488 + 8));
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001183d5;
    pfVar9 = afStack_2358;
    ppfVar11 = apfStack_2458;
    pfVar10 = (fdb_kvs_handle *)auStack_2488;
    pfVar17 = (fdb_encryption_key *)auStack_2490;
    pfVar14 = (fdb_config *)0x0;
    do {
      pfStack_24b0 = (fdb_encryption_key *)0x1182c8;
      sprintf((char *)pfVar9,"key%d",pfVar14);
      pfStack_24b0 = (fdb_encryption_key *)0x1182db;
      sprintf((char *)ppfVar11,"body%d",pfVar14);
      pfVar13 = pfStack_24a0;
      pfStack_24b0 = (fdb_encryption_key *)0x1182e8;
      sVar6 = strlen((char *)pfVar9);
      pfStack_24b0 = (fdb_encryption_key *)0x1182fd;
      fVar3 = fdb_get_kv(pfVar13,pfVar9,sVar6 + 1,(void **)pfVar10,(size_t *)pfVar17);
      pcVar18 = (char *)auStack_2488._0_8_;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001183b7;
      pfStack_24b0 = (fdb_encryption_key *)0x11831a;
      iVar4 = bcmp((void *)auStack_2488._0_8_,ppfVar11,(size_t)auStack_2490);
      if (iVar4 != 0) goto LAB_001183aa;
      pfStack_24b0 = (fdb_encryption_key *)0x11832a;
      fdb_free_block(pcVar18);
      uVar16 = (int)pfVar14 + 1;
      pfVar14 = (fdb_config *)(ulong)uVar16;
    } while (uVar16 != 5000);
    pfStack_24b0 = (fdb_encryption_key *)0x11833e;
    fVar3 = fdb_close(pfStack_2498);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      pfStack_24b0 = (fdb_encryption_key *)0x11834b;
      fdb_shutdown();
      pfStack_24b0 = (fdb_encryption_key *)0x118350;
      memleak_end();
      pcVar18 = "%s PASSED\n";
      if (auto_commit_test()::__test_pass != '\0') {
        pcVar18 = "%s FAILED\n";
      }
      pfStack_24b0 = (fdb_encryption_key *)0x118381;
      fprintf(_stderr,pcVar18,"auto commit test");
      return;
    }
  }
  else {
LAB_001183bc:
    pfStack_24b0 = (fdb_encryption_key *)0x1183c1;
    auto_commit_test();
    pcVar18 = (char *)pfVar13;
LAB_001183c1:
    pfStack_24b0 = (fdb_encryption_key *)0x1183c6;
    auto_commit_test();
LAB_001183c6:
    pfStack_24b0 = (fdb_encryption_key *)0x1183cb;
    auto_commit_test();
LAB_001183cb:
    pfStack_24b0 = (fdb_encryption_key *)0x1183d0;
    auto_commit_test();
LAB_001183d0:
    pfStack_24b0 = (fdb_encryption_key *)0x1183d5;
    auto_commit_test();
LAB_001183d5:
    pfStack_24b0 = (fdb_encryption_key *)0x1183da;
    auto_commit_test();
  }
  pfStack_24b0 = (fdb_encryption_key *)auto_commit_space_used_test;
  auto_commit_test();
  pcStack_2728 = (code *)0x1183fc;
  pfStack_24d8 = pfVar14;
  ppfStack_24d0 = ppfVar11;
  pfStack_24c8 = pfVar10;
  pfStack_24c0 = pfVar9;
  pfStack_24b8 = (fdb_kvs_handle *)pcVar18;
  pfStack_24b0 = pfVar17;
  gettimeofday(&tStack_26d8,(__timezone_ptr_t)0x0);
  pcStack_2728 = (code *)0x118401;
  memleak_start();
  pcStack_2728 = (code *)0x11840d;
  system("rm -rf  func_test* > errorlog.txt");
  pcStack_2728 = (code *)0x11841d;
  fdb_get_default_config();
  fStack_25d0.buffercache_size = 0;
  fStack_25d0.auto_commit = true;
  pcStack_2728 = (code *)0x118436;
  fdb_get_default_config();
  pcStack_2728 = (code *)0x118446;
  memcpy(&fStack_25d0,afStack_26c8,0xf8);
  pcStack_2728 = (code *)0x118450;
  fdb_get_default_kvs_config();
  uVar19 = 0xfffffffc;
  while( true ) {
    builtin_strncpy(acStack_2710 + 8,"est1",5);
    builtin_strncpy(acStack_2710,"./func_t",8);
    pcStack_2728 = (code *)0x11849b;
    fVar3 = fdb_open(&pfStack_2720,acStack_2710,&fStack_25d0);
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    pcStack_2728 = (code *)0x1184b7;
    fVar3 = fdb_kvs_open(pfStack_2720,&pfStack_2718,"justonekv",&fStack_26f0);
    if (fVar3 != FDB_RESULT_SUCCESS) {
      pcStack_2728 = (code *)0x118570;
      auto_commit_space_used_test();
      break;
    }
    pcStack_2728 = (code *)0x1184cd;
    fVar3 = fdb_get_file_info(pfStack_2720,afStack_26c8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011857a;
    if (afStack_26c8[0].file_size != fStack_25d0.blocksize * 7) {
      pcStack_2728 = (code *)0x11851c;
      auto_commit_space_used_test();
    }
    pcStack_2728 = (code *)0x1184f8;
    fVar3 = fdb_close(pfStack_2720);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118575;
    uVar16 = (int)uVar19 + 1;
    uVar19 = (ulong)uVar16;
    if (uVar16 == 0) {
      pcStack_2728 = (code *)0x118523;
      fdb_shutdown();
      pcStack_2728 = (code *)0x118528;
      memleak_end();
      pcVar18 = "%s PASSED\n";
      if (auto_commit_space_used_test()::__test_pass != '\0') {
        pcVar18 = "%s FAILED\n";
      }
      pcStack_2728 = (code *)0x118559;
      fprintf(_stderr,pcVar18,"auto_commit space used on close test");
      return;
    }
  }
  pcStack_2728 = (code *)0x118575;
  auto_commit_space_used_test();
LAB_00118575:
  pcStack_2728 = (code *)0x11857a;
  auto_commit_space_used_test();
LAB_0011857a:
  pcStack_2728 = last_wal_flush_header_test;
  auto_commit_space_used_test();
  uStack_2730 = 0x745f636e75662f2e;
  pcStack_2740 = "justonekv";
  ppfStack_2cc0 = (fdb_kvs_handle **)0x1185a2;
  ppfStack_2750 = &pfStack_2718;
  pcStack_2748 = acStack_2710;
  uStack_2738 = uVar19;
  pcStack_2728 = (code *)&pfStack_2720;
  gettimeofday(&tStack_2b60,(__timezone_ptr_t)0x0);
  ppfStack_2cc0 = (fdb_kvs_handle **)0x1185a7;
  memleak_start();
  pfStack_2ca8 = (fdb_doc *)0x0;
  ppfStack_2cc0 = (fdb_kvs_handle **)0x1185b8;
  system("rm -rf  dummy* > errorlog.txt");
  ppfStack_2cc0 = (fdb_kvs_handle **)0x1185c8;
  fdb_get_default_config();
  ppfStack_2cc0 = (fdb_kvs_handle **)0x1185d5;
  fdb_get_default_kvs_config();
  fStack_2b50.buffercache_size = 0;
  fStack_2b50.flags = 1;
  fStack_2b50.purging_interval = 0;
  fStack_2b50.compaction_threshold = '\0';
  ppfStack_2cc0 = (fdb_kvs_handle **)0x118608;
  fdb_open((fdb_file_handle **)(auStack_2c98 + 0x10),"dummy1",&fStack_2b50);
  ppfStack_2cc0 = (fdb_kvs_handle **)0x11861b;
  fdb_open((fdb_file_handle **)auStack_2c98,"dummy1",&fStack_2b50);
  ppfStack_2cc0 = (fdb_kvs_handle **)0x11862c;
  fdb_kvs_open_default((fdb_file_handle *)auStack_2c98._16_8_,&pfStack_2ca0,&fStack_2c70);
  ppfStack_2cc0 = (fdb_kvs_handle **)0x11863d;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_2c98._0_8_,(fdb_kvs_handle **)(auStack_2c98 + 8),
             &fStack_2c70);
  ppfVar21 = apfStack_2c58;
  uVar19 = 0;
  do {
    ppfStack_2cc0 = (fdb_kvs_handle **)0x118661;
    sprintf(acStack_2a58,"key%d",uVar19 & 0xffffffff);
    ppfStack_2cc0 = (fdb_kvs_handle **)0x11867d;
    sprintf(acStack_2858,"meta%d",uVar19 & 0xffffffff);
    ptr_fhandle = apfStack_2958;
    ppfStack_2cc0 = (fdb_kvs_handle **)0x118699;
    sprintf((char *)ptr_fhandle,"body%d",uVar19 & 0xffffffff);
    ppfStack_2cc0 = (fdb_kvs_handle **)0x1186a1;
    ppfVar11 = (fdb_kvs_handle **)strlen(acStack_2a58);
    ppfStack_2cc0 = (fdb_kvs_handle **)0x1186ac;
    sVar6 = strlen(acStack_2858);
    ppfStack_2cc0 = (fdb_kvs_handle **)0x1186b7;
    sVar7 = strlen((char *)ptr_fhandle);
    ppfStack_2cc0 = (fdb_kvs_handle **)0x1186d7;
    fdb_doc_create(ppfVar21,acStack_2a58,(size_t)ppfVar11,acStack_2858,sVar6,ptr_fhandle,sVar7);
    uVar19 = uVar19 + 1;
    ppfVar21 = ppfVar21 + 1;
  } while (uVar19 != 0x1e);
  ppfStack_2cc0 = (fdb_kvs_handle **)0x1186f7;
  fdb_set(pfStack_2ca0,apfStack_2c58[0]);
  ppfStack_2cc0 = (fdb_kvs_handle **)0x118706;
  fdb_set(pfStack_2ca0,apfStack_2c58[1]);
  ppfStack_2cc0 = (fdb_kvs_handle **)0x118715;
  fdb_begin_transaction((fdb_file_handle *)auStack_2c98._0_8_,'\x02');
  lVar12 = 0;
  do {
    ppfStack_2cc0 = (fdb_kvs_handle **)0x118726;
    fdb_set((fdb_kvs_handle *)auStack_2c98._8_8_,apfStack_2c58[lVar12 + 2]);
    lVar12 = lVar12 + 1;
  } while (lVar12 != 2);
  ppfStack_2cc0 = (fdb_kvs_handle **)0x118741;
  fdb_commit((fdb_file_handle *)auStack_2c98._16_8_,'\x01');
  ppfStack_2cc0 = (fdb_kvs_handle **)0x118749;
  fdb_close((fdb_file_handle *)auStack_2c98._16_8_);
  ppfStack_2cc0 = (fdb_kvs_handle **)0x118756;
  fdb_close((fdb_file_handle *)auStack_2c98._0_8_);
  ptr_handle_00 = (fdb_kvs_handle **)0x1541a5;
  pfVar14 = &fStack_2b50;
  ppfStack_2cc0 = (fdb_kvs_handle **)0x118773;
  fdb_open((fdb_file_handle **)(auStack_2c98 + 0x10),"dummy1",pfVar14);
  ppfStack_2cc0 = (fdb_kvs_handle **)0x118781;
  fdb_open((fdb_file_handle **)auStack_2c98,"dummy1",pfVar14);
  ppfStack_2cc0 = (fdb_kvs_handle **)0x118796;
  fdb_kvs_open_default((fdb_file_handle *)auStack_2c98._16_8_,&pfStack_2ca0,&fStack_2c70);
  ppfStack_2cc0 = (fdb_kvs_handle **)0x1187a6;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_2c98._0_8_,(fdb_kvs_handle **)(auStack_2c98 + 8),
             &fStack_2c70);
  uVar19 = 0;
  do {
    ppfStack_2cc0 = (fdb_kvs_handle **)0x1187d2;
    fdb_doc_create(&pfStack_2ca8,apfStack_2c58[uVar19]->key,apfStack_2c58[uVar19]->keylen,
                   (void *)0x0,0,(void *)0x0,0);
    ppfStack_2cc0 = (fdb_kvs_handle **)0x1187e1;
    fVar3 = fdb_get(pfStack_2ca0,pfStack_2ca8);
    if (uVar19 < 2) {
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118d89;
    }
    else if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_00118d8e;
    ppfStack_2cc0 = (fdb_kvs_handle **)0x118802;
    fdb_doc_free(pfStack_2ca8);
    pfStack_2ca8 = (fdb_doc *)0x0;
    uVar19 = uVar19 + 1;
  } while (uVar19 != 4);
  ppfStack_2cc0 = (fdb_kvs_handle **)0x118823;
  fdb_begin_transaction((fdb_file_handle *)auStack_2c98._0_8_,'\x02');
  lVar12 = 0;
  do {
    ppfStack_2cc0 = (fdb_kvs_handle **)0x118834;
    fdb_set((fdb_kvs_handle *)auStack_2c98._8_8_,apfStack_2c58[lVar12 + 2]);
    lVar12 = lVar12 + 1;
  } while (lVar12 != 2);
  lVar12 = 0;
  do {
    ppfStack_2cc0 = (fdb_kvs_handle **)0x118851;
    fdb_set(pfStack_2ca0,apfStack_2c58[lVar12 + 4]);
    lVar12 = lVar12 + 1;
  } while (lVar12 != 2);
  ppfStack_2cc0 = (fdb_kvs_handle **)0x11886c;
  fdb_end_transaction((fdb_file_handle *)auStack_2c98._0_8_,'\x01');
  ppfStack_2cc0 = (fdb_kvs_handle **)0x118879;
  fdb_close((fdb_file_handle *)auStack_2c98._16_8_);
  ppfStack_2cc0 = (fdb_kvs_handle **)0x118881;
  fdb_close((fdb_file_handle *)auStack_2c98._0_8_);
  ptr_handle_00 = (fdb_kvs_handle **)0x1541a5;
  pfVar14 = &fStack_2b50;
  ppfStack_2cc0 = (fdb_kvs_handle **)0x11889e;
  fdb_open((fdb_file_handle **)(auStack_2c98 + 0x10),"dummy1",pfVar14);
  ppfStack_2cc0 = (fdb_kvs_handle **)0x1188ac;
  fdb_open((fdb_file_handle **)auStack_2c98,"dummy1",pfVar14);
  ppfStack_2cc0 = (fdb_kvs_handle **)0x1188c1;
  fdb_kvs_open_default((fdb_file_handle *)auStack_2c98._16_8_,&pfStack_2ca0,&fStack_2c70);
  ppfStack_2cc0 = (fdb_kvs_handle **)0x1188d1;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_2c98._0_8_,(fdb_kvs_handle **)(auStack_2c98 + 8),
             &fStack_2c70);
  uVar19 = 0;
  do {
    ppfStack_2cc0 = (fdb_kvs_handle **)0x1188fd;
    fdb_doc_create(&pfStack_2ca8,apfStack_2c58[uVar19]->key,apfStack_2c58[uVar19]->keylen,
                   (void *)0x0,0,(void *)0x0,0);
    ppfStack_2cc0 = (fdb_kvs_handle **)0x11890c;
    fVar3 = fdb_get(pfStack_2ca0,pfStack_2ca8);
    if ((uVar19 < 4) && (fVar3 != FDB_RESULT_SUCCESS)) {
      ppfStack_2cc0 = (fdb_kvs_handle **)0x118d84;
      last_wal_flush_header_test();
      goto LAB_00118d84;
    }
    ppfStack_2cc0 = (fdb_kvs_handle **)0x118924;
    fdb_doc_free(pfStack_2ca8);
    pfStack_2ca8 = (fdb_doc *)0x0;
    uVar19 = uVar19 + 1;
  } while (uVar19 != 6);
  lVar12 = 0;
  do {
    ppfStack_2cc0 = (fdb_kvs_handle **)0x11894a;
    fdb_set(pfStack_2ca0,apfStack_2c58[lVar12 + 4]);
    lVar12 = lVar12 + 1;
  } while (lVar12 != 2);
  ppfStack_2cc0 = (fdb_kvs_handle **)0x118962;
  fdb_begin_transaction((fdb_file_handle *)auStack_2c98._0_8_,'\x02');
  lVar12 = 0;
  do {
    ppfStack_2cc0 = (fdb_kvs_handle **)0x118976;
    fdb_set((fdb_kvs_handle *)auStack_2c98._8_8_,apfStack_2c58[lVar12 + 6]);
    lVar12 = lVar12 + 1;
  } while (lVar12 != 2);
  ppfStack_2cc0 = (fdb_kvs_handle **)0x11898e;
  fdb_commit((fdb_file_handle *)auStack_2c98._16_8_,'\x01');
  ppfStack_2cc0 = (fdb_kvs_handle **)0x1189aa;
  fdb_open(&pfStack_2c80,"dummy1",&fStack_2b50);
  ppfStack_2cc0 = (fdb_kvs_handle **)0x1189bc;
  fdb_kvs_open_default(pfStack_2c80,&pfStack_2c78,&fStack_2c70);
  ppfStack_2cc0 = (fdb_kvs_handle **)0x1189c9;
  fdb_begin_transaction(pfStack_2c80,'\x02');
  lVar12 = 0;
  do {
    ppfStack_2cc0 = (fdb_kvs_handle **)0x1189dd;
    fdb_set(pfStack_2c78,apfStack_2c58[lVar12 + 8]);
    lVar12 = lVar12 + 1;
  } while (lVar12 != 2);
  ppfStack_2cc0 = (fdb_kvs_handle **)0x1189f5;
  fdb_end_transaction(pfStack_2c80,'\x01');
  ppfStack_2cc0 = (fdb_kvs_handle **)0x118a02;
  fdb_close((fdb_file_handle *)auStack_2c98._16_8_);
  ppfStack_2cc0 = (fdb_kvs_handle **)0x118a0c;
  fdb_close((fdb_file_handle *)auStack_2c98._0_8_);
  ppfStack_2cc0 = (fdb_kvs_handle **)0x118a16;
  fdb_close(pfStack_2c80);
  ppfStack_2cc0 = (fdb_kvs_handle **)0x118a2d;
  fdb_open((fdb_file_handle **)(auStack_2c98 + 0x10),"dummy1",&fStack_2b50);
  ppfStack_2cc0 = (fdb_kvs_handle **)0x118a3f;
  fdb_kvs_open_default((fdb_file_handle *)auStack_2c98._16_8_,&pfStack_2ca0,&fStack_2c70);
  uVar19 = 0;
  do {
    ppfStack_2cc0 = (fdb_kvs_handle **)0x118a6b;
    fdb_doc_create(&pfStack_2ca8,apfStack_2c58[uVar19]->key,apfStack_2c58[uVar19]->keylen,
                   (void *)0x0,0,(void *)0x0,0);
    ppfStack_2cc0 = (fdb_kvs_handle **)0x118a7a;
    fVar3 = fdb_get(pfStack_2ca0,pfStack_2ca8);
    if ((int)uVar19 - 8U < 0xfffffffe) {
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118d93;
    }
    else if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_00118d98;
    ppfStack_2cc0 = (fdb_kvs_handle **)0x118a9e;
    fdb_doc_free(pfStack_2ca8);
    pfStack_2ca8 = (fdb_doc *)0x0;
    uVar19 = uVar19 + 1;
  } while (uVar19 != 10);
  pfVar14 = (fdb_config *)auStack_2c98;
  ppfStack_2cc0 = (fdb_kvs_handle **)0x118ad2;
  fdb_open((fdb_file_handle **)pfVar14,"dummy1",&fStack_2b50);
  ptr_fhandle = &pfStack_2c80;
  ppfStack_2cc0 = (fdb_kvs_handle **)0x118ae5;
  fdb_open(ptr_fhandle,"dummy1",&fStack_2b50);
  ptr_handle_00 = (fdb_kvs_handle **)(auStack_2c98 + 8);
  ppfStack_2cc0 = (fdb_kvs_handle **)0x118afe;
  fdb_kvs_open_default((fdb_file_handle *)auStack_2c98._0_8_,ptr_handle_00,&fStack_2c70);
  ppfStack_2cc0 = (fdb_kvs_handle **)0x118b12;
  fdb_kvs_open_default(pfStack_2c80,&pfStack_2c78,&fStack_2c70);
  ppfStack_2cc0 = (fdb_kvs_handle **)0x118b20;
  fdb_begin_transaction((fdb_file_handle *)auStack_2c98._0_8_,'\x02');
  ppfVar11 = &pfStack_2ca0;
  ppfStack_2cc0 = (fdb_kvs_handle **)0x118b36;
  fdb_set(pfStack_2ca0,apfStack_2c58[10]);
  ppfStack_2cc0 = (fdb_kvs_handle **)0x118b48;
  fdb_commit((fdb_file_handle *)auStack_2c98._16_8_,'\x01');
  ppfStack_2cc0 = (fdb_kvs_handle **)0x118b59;
  fdb_set(pfStack_2ca0,apfStack_2c58[0xb]);
  ppfStack_2cc0 = (fdb_kvs_handle **)0x118b69;
  fdb_set((fdb_kvs_handle *)auStack_2c98._8_8_,apfStack_2c58[0xc]);
  ppfStack_2cc0 = (fdb_kvs_handle **)0x118b76;
  fdb_commit((fdb_file_handle *)auStack_2c98._16_8_,'\x01');
  ppfStack_2cc0 = (fdb_kvs_handle **)0x118b86;
  fdb_set((fdb_kvs_handle *)auStack_2c98._8_8_,apfStack_2c58[0xd]);
  ppfStack_2cc0 = (fdb_kvs_handle **)0x118b94;
  fdb_begin_transaction(pfStack_2c80,'\x02');
  ppfStack_2cc0 = (fdb_kvs_handle **)0x118ba4;
  fdb_set(pfStack_2c78,apfStack_2c58[0xe]);
  ppfStack_2cc0 = (fdb_kvs_handle **)0x118bb2;
  fdb_end_transaction((fdb_file_handle *)auStack_2c98._0_8_,'\x01');
  ppfStack_2cc0 = (fdb_kvs_handle **)0x118bc2;
  fdb_set(pfStack_2c78,apfStack_2c58[0xf]);
  ppfStack_2cc0 = (fdb_kvs_handle **)0x118bd3;
  fdb_set(pfStack_2ca0,apfStack_2c58[0x10]);
  ppfStack_2cc0 = (fdb_kvs_handle **)0x118be1;
  fdb_end_transaction(pfStack_2c80,'\x01');
  ppfStack_2cc0 = (fdb_kvs_handle **)0x118bf2;
  fdb_set(pfStack_2ca0,apfStack_2c58[0x11]);
  uVar19 = 0;
  ppfStack_2cc0 = (fdb_kvs_handle **)0x118bff;
  fdb_commit((fdb_file_handle *)auStack_2c98._16_8_,'\0');
  ppfStack_2cc0 = (fdb_kvs_handle **)0x118c07;
  fdb_close((fdb_file_handle *)auStack_2c98._16_8_);
  ppfStack_2cc0 = (fdb_kvs_handle **)0x118c10;
  fdb_close((fdb_file_handle *)auStack_2c98._0_8_);
  ppfStack_2cc0 = (fdb_kvs_handle **)0x118c19;
  fdb_close(pfStack_2c80);
  ppfStack_2cc0 = (fdb_kvs_handle **)0x118c30;
  fdb_open((fdb_file_handle **)(auStack_2c98 + 0x10),"dummy1",&fStack_2b50);
  ppfStack_2cc0 = (fdb_kvs_handle **)0x118c40;
  fdb_kvs_open_default((fdb_file_handle *)auStack_2c98._16_8_,ppfVar11,&fStack_2c70);
  while( true ) {
    ppfStack_2cc0 = (fdb_kvs_handle **)0x118c6c;
    fdb_doc_create(&pfStack_2ca8,apfStack_2c58[uVar19 + 10]->key,apfStack_2c58[uVar19 + 10]->keylen,
                   (void *)0x0,0,(void *)0x0,0);
    ppfStack_2cc0 = (fdb_kvs_handle **)0x118c7b;
    fVar3 = fdb_get(pfStack_2ca0,pfStack_2ca8);
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    ppfStack_2cc0 = (fdb_kvs_handle **)0x118c8d;
    fdb_doc_free(pfStack_2ca8);
    pfStack_2ca8 = (fdb_doc *)0x0;
    uVar19 = uVar19 + 1;
    if (uVar19 == 8) {
      ppfStack_2cc0 = (fdb_kvs_handle **)0x118cbb;
      fdb_open((fdb_file_handle **)auStack_2c98,"dummy1",&fStack_2b50);
      ppfStack_2cc0 = (fdb_kvs_handle **)0x118cd0;
      fdb_kvs_open_default
                ((fdb_file_handle *)auStack_2c98._0_8_,(fdb_kvs_handle **)(auStack_2c98 + 8),
                 &fStack_2c70);
      ppfStack_2cc0 = (fdb_kvs_handle **)0x118cdd;
      fdb_begin_transaction((fdb_file_handle *)auStack_2c98._0_8_,'\x02');
      ppfStack_2cc0 = (fdb_kvs_handle **)0x118ced;
      fdb_set((fdb_kvs_handle *)auStack_2c98._8_8_,apfStack_2c58[0x14]);
      ppfStack_2cc0 = (fdb_kvs_handle **)0x118cfe;
      fdb_compact((fdb_file_handle *)auStack_2c98._16_8_,"dummy2");
      ppfStack_2cc0 = (fdb_kvs_handle **)0x118d0b;
      fdb_end_transaction((fdb_file_handle *)auStack_2c98._0_8_,'\x01');
      ppfStack_2cc0 = (fdb_kvs_handle **)0x118d15;
      fdb_close((fdb_file_handle *)auStack_2c98._16_8_);
      ppfStack_2cc0 = (fdb_kvs_handle **)0x118d1d;
      fdb_close((fdb_file_handle *)auStack_2c98._0_8_);
      lVar12 = 0;
      do {
        ppfStack_2cc0 = (fdb_kvs_handle **)0x118d29;
        fdb_doc_free(apfStack_2c58[lVar12]);
        lVar12 = lVar12 + 1;
      } while (lVar12 != 0x1e);
      ppfStack_2cc0 = (fdb_kvs_handle **)0x118d37;
      fdb_shutdown();
      ppfStack_2cc0 = (fdb_kvs_handle **)0x118d3c;
      memleak_end();
      pcVar18 = "%s PASSED\n";
      if (last_wal_flush_header_test()::__test_pass != '\0') {
        pcVar18 = "%s FAILED\n";
      }
      ppfStack_2cc0 = (fdb_kvs_handle **)0x118d6d;
      fprintf(_stderr,pcVar18,"last wal flush header test");
      return;
    }
  }
LAB_00118d84:
  ppfStack_2cc0 = (fdb_kvs_handle **)0x118d89;
  last_wal_flush_header_test();
LAB_00118d89:
  ppfStack_2cc0 = (fdb_kvs_handle **)0x118d8e;
  last_wal_flush_header_test();
LAB_00118d8e:
  ppfStack_2cc0 = (fdb_kvs_handle **)0x118d93;
  last_wal_flush_header_test();
LAB_00118d93:
  ppfStack_2cc0 = (fdb_kvs_handle **)0x118d98;
  last_wal_flush_header_test();
LAB_00118d98:
  ppfStack_2cc0 = (fdb_kvs_handle **)long_key_test;
  last_wal_flush_header_test();
  pfStack_18f08 = (fdb_doc *)0x118dba;
  ppfStack_2ce8 = &pfStack_2ca8;
  pfStack_2ce0 = pfVar14;
  ppfStack_2cd8 = ptr_fhandle;
  uStack_2cd0 = uVar19;
  ppfStack_2cc8 = ptr_handle_00;
  ppfStack_2cc0 = ppfVar11;
  gettimeofday(&tStack_18ea0,(__timezone_ptr_t)0x0);
  pfStack_18f08 = (fdb_doc *)0x118dbf;
  memleak_start();
  pfStack_18ef0 = (fdb_doc *)0x0;
  pfStack_18f08 = (fdb_doc *)0x118dd4;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_18f08 = (fdb_doc *)0x118de4;
  fdb_get_default_config();
  pfStack_18f08 = (fdb_doc *)0x118df1;
  fdb_get_default_kvs_config();
  fStack_18c28.flags = 1;
  fStack_18c28.purging_interval = 0;
  fStack_18c28.compaction_threshold = '\0';
  fStack_18c28.durability_opt = '\x02';
  pfStack_18f08 = (fdb_doc *)0x118e1e;
  fdb_open(&pfStack_18ee8,"dummy1",&fStack_18c28);
  pfStack_18f08 = (fdb_doc *)0x118e2e;
  fdb_kvs_open_default(pfStack_18ee8,&pfStack_18ed8,&fStack_18e90);
  ppfVar21 = apfStack_18a30;
  pfVar9 = afStack_18e30;
  pfVar15 = (fdb_doc *)0x0;
  lVar12 = 0;
  do {
    sVar6 = 0xff7f;
    if (lVar12 == 1) {
      sVar6 = 0x1fff;
    }
    if (lVar12 == 0) {
      sVar6 = 0x7fff;
    }
    pfStack_18f08 = (fdb_doc *)0x118e7c;
    lStack_18ed0 = lVar12;
    memset(asStack_12c70,0x5f,sVar6);
    *(undefined1 *)((long)asStack_12c70 + sVar6) = 0;
    lVar12 = 0;
    doc_00 = ppfVar21;
    lStack_18ec8 = (long)pfVar15;
    ppfStack_18ec0 = ppfVar21;
    sStack_18ea8 = sVar6;
    do {
      pfStack_18f08 = (fdb_doc *)0x118eb2;
      lStack_18eb8 = lVar12;
      sprintf((char *)pfVar9,"%08d");
      asStack_12c70[0] = afStack_18e30[0].keylen;
      uVar19 = 0;
      lStack_18ee0 = (long)pfVar15;
      ppfStack_18eb0 = doc_00;
      do {
        pfStack_18f08 = (fdb_doc *)0x118eee;
        sprintf((char *)pfVar9,"%08d",uVar19 & 0xffffffff);
        *(size_t *)((long)apfStack_18a30 + sStack_18ea8 + 0x5db8) = afStack_18e30[0].keylen;
        uVar16 = (int)lStack_18ee0 + (int)uVar19;
        pfStack_18f08 = (fdb_doc *)0x118f27;
        sprintf(acStack_18b30,"meta%d",(ulong)uVar16);
        pfStack_18f08 = (fdb_doc *)0x118f3a;
        sprintf(acStack_18d30,"body%d",(ulong)uVar16);
        pfStack_18f08 = (fdb_doc *)0x118f47;
        sVar6 = strlen((char *)asStack_12c70);
        pfStack_18f08 = (fdb_doc *)0x118f53;
        sVar7 = strlen(acStack_18b30);
        pfStack_18f08 = (fdb_doc *)0x118f67;
        sVar8 = strlen(acStack_18d30);
        lVar1 = lStack_18ee0;
        pcVar18 = acStack_18d30;
        pfStack_18f08 = (fdb_doc *)0x118f9a;
        fdb_doc_create(doc_00,asStack_12c70,sVar6 + 1,acStack_18b30,sVar7 + 1,pcVar18,sVar8 + 1);
        uVar19 = uVar19 + 1;
        doc_00 = doc_00 + 1;
      } while (uVar19 != 10);
      lVar12 = lStack_18eb8 + 1;
      doc_00 = ppfStack_18eb0 + 10;
      pfVar15 = (fdb_doc *)(lVar1 + 10);
    } while (lVar12 != 100);
    lVar12 = lStack_18ed0 + 1;
    ppfVar21 = ppfStack_18ec0 + 1000;
    pfVar15 = (fdb_doc *)(lStack_18ec8 + 1000);
  } while (lVar12 != 3);
  lVar12 = 0;
  do {
    pfStack_18f08 = (fdb_doc *)0x119010;
    fdb_set(pfStack_18ed8,apfStack_18a30[lVar12]);
    lVar12 = lVar12 + 1;
  } while (lVar12 != 3000);
  pfStack_18f08 = (fdb_doc *)0x11902b;
  fdb_commit(pfStack_18ee8,'\x01');
  pfStack_18f08 = (fdb_doc *)0x119040;
  fdb_get_file_info(pfStack_18ee8,&fStack_18e78);
  if (fStack_18e78.doc_count != 3000) {
    pfStack_18f08 = (fdb_doc *)0x119057;
    long_key_test();
  }
  lVar12 = 0;
  while( true ) {
    pfStack_18f08 = (fdb_doc *)0x119086;
    fdb_doc_create(&pfStack_18ef0,apfStack_18a30[lVar12]->key,apfStack_18a30[lVar12]->keylen,
                   (void *)0x0,0,(void *)0x0,0);
    pfStack_18f08 = (fdb_doc *)0x119095;
    fVar3 = fdb_get(pfStack_18ed8,pfStack_18ef0);
    pfVar20 = pfStack_18ef0;
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    doc_00 = (fdb_doc **)pfStack_18ef0->key;
    pfVar9 = apfStack_18a30[lVar12];
    pcVar18 = (char *)pfVar9->key;
    pfStack_18f08 = (fdb_doc *)0x1190c0;
    iVar4 = bcmp(doc_00,pcVar18,pfStack_18ef0->keylen);
    pfVar15 = pfVar20;
    if (iVar4 != 0) {
      pfStack_18f08 = (fdb_doc *)0x1191a4;
      long_key_test();
      break;
    }
    doc_00 = (fdb_doc **)pfVar20->meta;
    pcVar18 = (char *)pfVar9->meta;
    pfStack_18f08 = (fdb_doc *)0x1190df;
    iVar4 = bcmp(doc_00,pcVar18,pfVar20->metalen);
    if (iVar4 != 0) goto LAB_001191b4;
    doc_00 = (fdb_doc **)pfVar20->body;
    pcVar18 = (char *)pfVar9->body;
    pfStack_18f08 = (fdb_doc *)0x1190fe;
    iVar4 = bcmp(doc_00,pcVar18,pfVar20->bodylen);
    if (iVar4 != 0) goto LAB_001191a9;
    pfStack_18f08 = (fdb_doc *)0x11910e;
    fdb_doc_free(pfVar20);
    pfStack_18ef0 = (fdb_doc *)0x0;
    lVar12 = lVar12 + 1;
    if (lVar12 == 3000) {
      pfStack_18f08 = (fdb_doc *)0x119131;
      fdb_close(pfStack_18ee8);
      lVar12 = 0;
      do {
        pfStack_18f08 = (fdb_doc *)0x119140;
        fdb_doc_free(apfStack_18a30[lVar12]);
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3000);
      pfStack_18f08 = (fdb_doc *)0x119151;
      fdb_shutdown();
      pfStack_18f08 = (fdb_doc *)0x119156;
      memleak_end();
      pcVar18 = "%s PASSED\n";
      if (long_key_test()::__test_pass != '\0') {
        pcVar18 = "%s FAILED\n";
      }
      pfStack_18f08 = (fdb_doc *)0x119187;
      fprintf(_stderr,pcVar18,"long key test");
      return;
    }
  }
  pfStack_18f08 = (fdb_doc *)0x1191a9;
  long_key_test();
LAB_001191a9:
  pfStack_18f08 = (fdb_doc *)0x1191b4;
  long_key_test();
LAB_001191b4:
  pfStack_18f08 = (fdb_doc *)open_multi_files_kvs_test;
  long_key_test();
  pfStack_1d400 = (fdb_kvs_handle *)0x1191df;
  ppfStack_18f30 = &pfStack_18ef0;
  pcStack_18f28 = pcVar18;
  lStack_18f20 = lVar12;
  pfStack_18f18 = pfVar15;
  ppfStack_18f10 = doc_00;
  pfStack_18f08 = pfVar9;
  gettimeofday((timeval *)(auStack_1d378 + 0x30),(__timezone_ptr_t)0x0);
  pfStack_1d400 = (fdb_kvs_handle *)0x1191e4;
  memleak_start();
  pfStack_1d400 = (fdb_kvs_handle *)0x1191f0;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_1d400 = (fdb_kvs_handle *)0x119200;
  fdb_get_default_config();
  pfStack_1d400 = (fdb_kvs_handle *)0x11920a;
  fdb_get_default_kvs_config();
  fStack_1d230.wal_threshold = 0x400;
  fStack_1d230.compaction_mode = '\0';
  fStack_1d230.durability_opt = '\x02';
  pcVar22 = (char *)&fStack_1cf38;
  doc = apfStack_1d138;
  pcVar18 = "kvs%d";
  uVar19 = 0;
  ptr_iterator = (fdb_iterator **)0x0;
  do {
    pfStack_1d400 = (fdb_kvs_handle *)0x11924a;
    sprintf((char *)doc,"dummy%d",(ulong)ptr_iterator & 0xffffffff);
    ptr_handle = (char *)(apfStack_1d3b8 + (long)ptr_iterator);
    pfStack_1d400 = (fdb_kvs_handle *)0x119265;
    fVar3 = fdb_open((fdb_file_handle **)ptr_handle,(char *)doc,&fStack_1d230);
    pfVar10 = (fdb_kvs_handle *)pcVar22;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011969e;
    ppfVar2 = (fdb_iterator **)0x0;
    ppfStack_1d3e0 = ptr_iterator;
    pfStack_1d3d8 = (fdb_kvs_handle *)pcVar22;
    do {
      ptr_iterator = ppfVar2;
      pfStack_1d400 = (fdb_kvs_handle *)0x11928b;
      sprintf((char *)doc,"kvs%d",(ulong)(uint)((int)ptr_iterator + (int)uVar19));
      pfStack_1d400 = (fdb_kvs_handle *)0x11929e;
      fVar3 = fdb_kvs_open((fdb_file_handle *)*(fdb_kvs_handle **)ptr_handle,
                           (fdb_kvs_handle **)pcVar22,(char *)doc,&fStack_1d3d0);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pfStack_1d400 = (fdb_kvs_handle *)0x11968a;
        open_multi_files_kvs_test();
        goto LAB_0011968a;
      }
      pcVar22 = (char *)&(((fdb_kvs_handle *)pcVar22)->kvs_config).custom_cmp;
      ppfVar2 = (fdb_iterator **)((long)ptr_iterator + 1);
    } while ((fdb_iterator **)((long)ptr_iterator + 1) != (fdb_iterator **)0x80);
    ptr_iterator = (fdb_iterator **)((long)ppfStack_1d3e0 + 1);
    uVar19 = uVar19 + 0x80;
    pcVar22 = (char *)&pfStack_1d3d8[1].bub_ctx.space_used;
  } while (ptr_iterator != (fdb_iterator **)0x8);
  ptr_iterator = apfStack_1d338;
  doc = apfStack_1d038;
  pfVar10 = (fdb_kvs_handle *)0x0;
  do {
    uVar19 = 0;
    do {
      pfStack_1d400 = (fdb_kvs_handle *)0x119300;
      sprintf((char *)ptr_iterator,"key%08d",uVar19);
      pfStack_1d400 = (fdb_kvs_handle *)0x119313;
      sprintf((char *)doc,"value%08d",uVar19);
      pcVar18 = *(char **)(&fStack_1cf38.kvs_config.create_if_missing + (long)pfVar10 * 8);
      pfStack_1d400 = (fdb_kvs_handle *)0x119323;
      sVar6 = strlen((char *)ptr_iterator);
      ptr_handle = (char *)(sVar6 + 1);
      pfStack_1d400 = (fdb_kvs_handle *)0x11932f;
      sVar6 = strlen((char *)doc);
      pfStack_1d400 = (fdb_kvs_handle *)0x119344;
      fVar3 = fdb_set_kv((fdb_kvs_handle *)pcVar18,ptr_iterator,(size_t)ptr_handle,doc,sVar6 + 1);
      pcVar22 = (char *)pfVar10;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011968a;
      uVar16 = (int)uVar19 + 1;
      uVar19 = (ulong)uVar16;
    } while (uVar16 != 10);
    pfVar10 = (fdb_kvs_handle *)&(pfVar10->kvs_config).field_0x1;
  } while (pfVar10 != (fdb_kvs_handle *)0x400);
  ptr_handle = (char *)0x0;
  do {
    if (((ulong)ptr_handle & 1) == 0) {
      pfStack_1d400 = (fdb_kvs_handle *)0x119372;
      fVar3 = fdb_commit((fdb_file_handle *)apfStack_1d3b8[(long)ptr_handle],'\0');
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196bc;
    }
    else {
      pfStack_1d400 = (fdb_kvs_handle *)0x119385;
      fVar3 = fdb_commit((fdb_file_handle *)apfStack_1d3b8[(long)ptr_handle],'\x01');
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196c1;
    }
    ptr_handle = (char *)((long)ptr_handle + 1);
  } while ((fdb_kvs_handle **)ptr_handle != (fdb_kvs_handle **)0x8);
  doc = (fdb_iterator **)0xffffffffffffff80;
  ptr_handle = (char *)apfStack_1af38;
  ptr_iterator = (fdb_iterator **)(auStack_1d378 + 8);
  pfVar10 = (fdb_kvs_handle *)auStack_1d378;
  do {
    pfStack_1d400 = (fdb_kvs_handle *)0x1193c5;
    fdb_get_kvs_info((fdb_kvs_handle *)auStack_1cb38[(long)doc],(fdb_kvs_info *)pfVar10);
    if ((fdb_custom_cmp_variable)auStack_1d378._8_8_ != (fdb_custom_cmp_variable)0xa) {
      pfStack_1d400 = (fdb_kvs_handle *)0x11940b;
      open_multi_files_kvs_test();
    }
    pfStack_1d400 = (fdb_kvs_handle *)0x1193e5;
    fVar3 = fdb_snapshot_open((fdb_kvs_handle *)auStack_1cb38[(long)doc],
                              (fdb_kvs_handle **)ptr_handle,10);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196a3;
    doc = doc + 0x10;
    ptr_handle = (char *)((long)ptr_handle + 0x400);
  } while (doc < (fdb_iterator **)0x380);
  ptr_handle = (char *)0x0;
  do {
    pfStack_1d400 = (fdb_kvs_handle *)0x11941b;
    fVar3 = fdb_compact((fdb_file_handle *)apfStack_1d3b8[(long)ptr_handle],(char *)0x0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196a8;
    ptr_handle = (char *)((long)ptr_handle + 1);
  } while ((fdb_kvs_handle **)ptr_handle != (fdb_kvs_handle **)0x8);
  ptr_handle = (char *)&pfStack_1d3e8;
  pfStack_1d3e8 = (fdb_kvs_handle *)0x0;
  ptr_iterator = &pfStack_1d3f0;
  pcVar22 = "key%08d";
  doc = apfStack_1d338;
  pfVar10 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_1d400 = (fdb_kvs_handle *)0x119470;
    fdb_iterator_init(apfStack_1af38[(long)pfVar10],ptr_iterator,(void *)0x0,0,(void *)0x0,0,0);
    uVar19 = 0;
    do {
      pfStack_1d400 = (fdb_kvs_handle *)0x11947f;
      fVar3 = fdb_iterator_get(pfStack_1d3f0,(fdb_doc **)ptr_handle);
      pcVar18 = (char *)pfVar10;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011968f;
      pfStack_1d400 = (fdb_kvs_handle *)0x119496;
      sprintf((char *)doc,"key%08d",uVar19);
      pfStack_1d400 = (fdb_kvs_handle *)0x1194a7;
      iVar4 = strcmp((char *)doc,(char *)pfStack_1d3e8->op_stats);
      if (iVar4 != 0) {
        pfStack_1d400 = (fdb_kvs_handle *)0x1194c9;
        open_multi_files_kvs_test();
      }
      uVar19 = (ulong)((int)uVar19 + 1);
      pfStack_1d400 = (fdb_kvs_handle *)0x1194b7;
      fVar3 = fdb_iterator_next(pfStack_1d3f0);
    } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
    pfStack_1d400 = (fdb_kvs_handle *)0x1194d5;
    fdb_iterator_close(pfStack_1d3f0);
    pcVar18 = (char *)&(pfVar10->config).wal_threshold;
    bVar23 = pfVar10 < (fdb_kvs_handle *)0x380;
    pfVar10 = (fdb_kvs_handle *)pcVar18;
  } while (bVar23);
  pfStack_1d400 = (fdb_kvs_handle *)0x1194f6;
  fdb_doc_free((fdb_doc *)pfStack_1d3e8);
  ptr_handle = "key%08d";
  ptr_iterator = apfStack_1d338;
  doc = (fdb_iterator **)0x0;
  do {
    uVar19 = 0;
    do {
      pfStack_1d400 = (fdb_kvs_handle *)0x119519;
      sprintf((char *)ptr_iterator,"key%08d",uVar19);
      pcVar22 = *(char **)(&fStack_1cf38.kvs_config.create_if_missing + (long)doc * 8);
      pfStack_1d400 = (fdb_kvs_handle *)0x119529;
      sVar6 = strlen((char *)ptr_iterator);
      pfStack_1d400 = (fdb_kvs_handle *)0x119538;
      fVar3 = fdb_del_kv((fdb_kvs_handle *)pcVar22,ptr_iterator,sVar6 + 1);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119694;
      uVar16 = (int)uVar19 + 1;
      uVar19 = (ulong)uVar16;
    } while (uVar16 != 10);
    doc = (fdb_iterator **)((long)doc + 1);
  } while (doc != (fdb_iterator **)0x400);
  ptr_handle = "dummy_compact%d";
  ptr_iterator = apfStack_1d138;
  pfVar10 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_1d400 = (fdb_kvs_handle *)0x119575;
    sprintf((char *)ptr_iterator,"dummy_compact%d",(ulong)pfVar10 & 0xffffffff);
    pfStack_1d400 = (fdb_kvs_handle *)0x119582;
    fVar3 = fdb_compact((fdb_file_handle *)apfStack_1d3b8[(long)pfVar10],(char *)ptr_iterator);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196ad;
    pfVar10 = (fdb_kvs_handle *)&(pfVar10->kvs_config).field_0x1;
  } while (pfVar10 != (fdb_kvs_handle *)0x8);
  ptr_handle = (char *)&pfStack_1d3e8;
  pfStack_1d3e8 = (fdb_kvs_handle *)0x0;
  ptr_iterator = &pfStack_1d3f0;
  pcVar22 = (char *)(fdb_kvs_handle *)0x0;
  do {
    pfStack_1d400 = (fdb_kvs_handle *)0x1195c8;
    fVar3 = fdb_iterator_init(*(fdb_kvs_handle **)
                               (&fStack_1cf38.kvs_config.create_if_missing + (long)pcVar22 * 8),
                              ptr_iterator,(void *)0x0,0,(void *)0x0,0,2);
    pfVar10 = (fdb_kvs_handle *)pcVar22;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196b2;
    do {
      pfStack_1d400 = (fdb_kvs_handle *)0x1195dd;
      fVar3 = fdb_iterator_get(pfStack_1d3f0,(fdb_doc **)ptr_handle);
      if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_00119699;
      pfStack_1d400 = (fdb_kvs_handle *)0x1195ef;
      fVar3 = fdb_iterator_next(pfStack_1d3f0);
    } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
    pfStack_1d400 = (fdb_kvs_handle *)0x1195fe;
    fdb_iterator_close(pfStack_1d3f0);
    pfVar10 = (fdb_kvs_handle *)&(((fdb_kvs_handle *)pcVar22)->config).wal_threshold;
    bVar23 = pcVar22 < (fdb_kvs_handle *)0x380;
    pcVar22 = (char *)pfVar10;
  } while (bVar23);
  pfStack_1d400 = (fdb_kvs_handle *)0x11961b;
  fdb_doc_free((fdb_doc *)pfStack_1d3e8);
  ptr_handle = (char *)0x0;
  while( true ) {
    pfStack_1d400 = (fdb_kvs_handle *)0x119627;
    fVar3 = fdb_close((fdb_file_handle *)apfStack_1d3b8[(long)ptr_handle]);
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    ptr_handle = (char *)((long)ptr_handle + 1);
    if ((fdb_kvs_handle **)ptr_handle == (fdb_kvs_handle **)0x8) {
      pfStack_1d400 = (fdb_kvs_handle *)0x11963d;
      fdb_shutdown();
      pfStack_1d400 = (fdb_kvs_handle *)0x119642;
      memleak_end();
      pcVar18 = "%s PASSED\n";
      if (open_multi_files_kvs_test()::__test_pass != '\0') {
        pcVar18 = "%s FAILED\n";
      }
      pfStack_1d400 = (fdb_kvs_handle *)0x119673;
      fprintf(_stderr,pcVar18,"open multi files kvs test");
      return;
    }
  }
LAB_001196b7:
  pfStack_1d400 = (fdb_kvs_handle *)0x1196bc;
  open_multi_files_kvs_test();
LAB_001196bc:
  pfStack_1d400 = (fdb_kvs_handle *)0x1196c1;
  open_multi_files_kvs_test();
LAB_001196c1:
  pfStack_1d400 = (fdb_kvs_handle *)get_byoffset_diff_kvs_test;
  open_multi_files_kvs_test();
  pcStack_1d778 = (code *)0x1196e0;
  ppfStack_1d418 = (fdb_kvs_handle **)ptr_handle;
  ppfStack_1d410 = doc;
  ppfStack_1d408 = ptr_iterator;
  pfStack_1d400 = pfVar10;
  gettimeofday(&tStack_1d728,(__timezone_ptr_t)0x0);
  pcStack_1d778 = (code *)0x1196e5;
  memleak_start();
  pcStack_1d778 = (code *)0x1196f1;
  system("rm -rf  dummy* > errorlog.txt");
  pfVar14 = &fStack_1d718;
  pcStack_1d778 = (code *)0x1196fe;
  fdb_get_default_config();
  pcStack_1d778 = (code *)0x119708;
  fdb_get_default_kvs_config();
  pcStack_1d778 = (code *)0x11971c;
  fVar3 = fdb_open(&pfStack_1d758,"./dummy1",pfVar14);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pcStack_1d778 = (code *)0x11973f;
    fVar3 = fdb_kvs_open(pfStack_1d758,&pfStack_1d750,"db",&fStack_1d740);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001198f2;
    pcStack_1d778 = (code *)0x119762;
    fVar3 = fdb_kvs_open(pfStack_1d758,&pfStack_1d748,"db2",&fStack_1d740);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001198f7;
    pfVar14 = &fStack_1d520;
    pcStack_1d778 = (code *)0x119785;
    sprintf((char *)pfVar14,"key%d",0);
    ptr_iterator = apfStack_1d620;
    pcStack_1d778 = (code *)0x1197a0;
    sprintf((char *)ptr_iterator,"body%d",0);
    pcStack_1d778 = (code *)0x1197a8;
    pfVar10 = (fdb_kvs_handle *)strlen((char *)pfVar14);
    pcStack_1d778 = (code *)0x1197b3;
    sVar6 = strlen((char *)ptr_iterator);
    doc = &pfStack_1d760;
    pcStack_1d778 = (code *)0x1197d5;
    fdb_doc_create((fdb_doc **)doc,pfVar14,(size_t)pfVar10,(void *)0x0,0,ptr_iterator,sVar6 + 1);
    pcStack_1d778 = (code *)0x1197e3;
    fVar3 = fdb_set(pfStack_1d750,(fdb_doc *)pfStack_1d760);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001198fc;
    pcStack_1d778 = (code *)0x1197fa;
    fVar3 = fdb_commit(pfStack_1d758,'\x01');
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119901;
    pcStack_1d778 = (code *)0x11981b;
    sprintf((char *)pfStack_1d760->tree_cursor_prev,"bOdy%d",0);
    pcStack_1d778 = (code *)0x11982a;
    fVar3 = fdb_set(pfStack_1d748,(fdb_doc *)pfStack_1d760);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119906;
    pcStack_1d778 = (code *)0x119841;
    fVar3 = fdb_commit(pfStack_1d758,'\x01');
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011990b;
    pcStack_1d778 = (code *)0x119858;
    fVar3 = fdb_get_metaonly(pfStack_1d750,(fdb_doc *)pfStack_1d760);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119910;
    pcStack_1d778 = (code *)0x11986f;
    fVar3 = fdb_get_metaonly(pfStack_1d748,(fdb_doc *)pfStack_1d760);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119915;
    pcStack_1d778 = (code *)0x119886;
    fVar3 = fdb_get_byoffset(pfStack_1d750,(fdb_doc *)pfStack_1d760);
    if (fVar3 == FDB_RESULT_KEY_NOT_FOUND) {
      pcStack_1d778 = (code *)0x119899;
      fdb_close(pfStack_1d758);
      pcStack_1d778 = (code *)0x1198a3;
      fdb_doc_free((fdb_doc *)pfStack_1d760);
      pcStack_1d778 = (code *)0x1198a8;
      fdb_shutdown();
      pcStack_1d778 = (code *)0x1198ad;
      memleak_end();
      pcVar18 = "%s PASSED\n";
      if (get_byoffset_diff_kvs_test()::__test_pass != '\0') {
        pcVar18 = "%s FAILED\n";
      }
      pcStack_1d778 = (code *)0x1198de;
      fprintf(_stderr,pcVar18,"get byoffset diff kvs");
      return;
    }
  }
  else {
    pcStack_1d778 = (code *)0x1198f2;
    get_byoffset_diff_kvs_test();
LAB_001198f2:
    pcStack_1d778 = (code *)0x1198f7;
    get_byoffset_diff_kvs_test();
LAB_001198f7:
    pcStack_1d778 = (code *)0x1198fc;
    get_byoffset_diff_kvs_test();
LAB_001198fc:
    pcStack_1d778 = (code *)0x119901;
    get_byoffset_diff_kvs_test();
LAB_00119901:
    pcStack_1d778 = (code *)0x119906;
    get_byoffset_diff_kvs_test();
LAB_00119906:
    pcStack_1d778 = (code *)0x11990b;
    get_byoffset_diff_kvs_test();
LAB_0011990b:
    pcStack_1d778 = (code *)0x119910;
    get_byoffset_diff_kvs_test();
LAB_00119910:
    pcStack_1d778 = (code *)0x119915;
    get_byoffset_diff_kvs_test();
LAB_00119915:
    pcStack_1d778 = (code *)0x11991a;
    get_byoffset_diff_kvs_test();
  }
  pcStack_1d778 = rekey_test;
  get_byoffset_diff_kvs_test();
  pfStack_1d7a0 = pfVar14;
  ppfStack_1d798 = doc;
  pfStack_1d790 = (fdb_kvs_handle *)pcVar18;
  ppfStack_1d788 = ptr_iterator;
  pfStack_1d780 = pfVar10;
  pcStack_1d778 = (code *)uVar19;
  gettimeofday(&tStack_1dbb0,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  dummy* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fStack_1dba0.wal_threshold = 0x400;
  fStack_1dba0.flags = 1;
  fStack_1dba0.purging_interval = 0;
  fStack_1dba0.compaction_threshold = '\0';
  fStack_1dba0.encryption_key.algorithm = -1;
  builtin_memcpy(fStack_1dba0.encryption_key.bytes,"BBBBBBBBBBBBBBBBBBBBBBBBBBBBBBBB",0x20);
  fdb_open(&pfStack_1dc08,"./dummy1",&fStack_1dba0);
  fdb_kvs_open_default(pfStack_1dc08,&pfStack_1dc10,&fStack_1dbc8);
  fVar3 = fdb_set_log_callback(pfStack_1dc10,logCallbackFunc,"api_wrapper_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    fVar3 = fdb_set_kv(pfStack_1dc10,(void *)0x0,0,(void *)0x0,0);
    if (fVar3 != FDB_RESULT_INVALID_ARGS) goto LAB_00119c74;
    uVar19 = 0;
    do {
      sprintf(acStack_1d9a8,"key%d",uVar19);
      sprintf(acStack_1d8a8,"body%d",uVar19);
      pfVar10 = pfStack_1dc10;
      sVar6 = strlen(acStack_1d9a8);
      sVar7 = strlen(acStack_1d8a8);
      fVar3 = fdb_set_kv(pfVar10,acStack_1d9a8,sVar6,acStack_1d8a8,sVar7);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        rekey_test();
        goto LAB_00119c56;
      }
      uVar16 = (int)uVar19 + 1;
      uVar19 = (ulong)uVar16;
    } while (uVar16 != 10);
    asStack_1dbf8[1] = 0x726162ffffffff;
    asStack_1dbf8[2] = 0xbdbdbdbdbdbdbdbd;
    uStack_1dbe0 = 0xbdbdbdbd;
    uStack_1dbdc = 0xbdbdbdbd;
    uStack_1dbd8 = 0xbdbdbdbd;
    uStack_1dbd4 = 0xbdbdbdbd;
    uStack_1dbd0 = 0xbdbdbdbd;
    new_key.bytes[4] = 0xbd;
    new_key.bytes[5] = 0xbd;
    new_key.bytes[6] = 0xbd;
    new_key.bytes[7] = 0xbd;
    new_key.bytes[8] = 0xbd;
    new_key.bytes[9] = 0xbd;
    new_key.bytes[10] = 0xbd;
    new_key.bytes[0xb] = 0xbd;
    new_key.algorithm = -1;
    new_key.bytes[0] = 'b';
    new_key.bytes[1] = 'a';
    new_key.bytes[2] = 'r';
    new_key.bytes[3] = '\0';
    new_key.bytes[0xc] = 0xbd;
    new_key.bytes[0xd] = 0xbd;
    new_key.bytes[0xe] = 0xbd;
    new_key.bytes[0xf] = 0xbd;
    new_key.bytes[0x10] = 0xbd;
    new_key.bytes[0x11] = 0xbd;
    new_key.bytes[0x12] = 0xbd;
    new_key.bytes[0x13] = 0xbd;
    new_key.bytes[0x14] = 0xbd;
    new_key.bytes[0x15] = 0xbd;
    new_key.bytes[0x16] = 0xbd;
    new_key.bytes[0x17] = 0xbd;
    new_key.bytes[0x18] = 0xbd;
    new_key.bytes[0x19] = 0xbd;
    new_key.bytes[0x1a] = 0xbd;
    new_key.bytes[0x1b] = 0xbd;
    new_key.bytes[0x1c] = 0xbd;
    new_key.bytes[0x1d] = 0xbd;
    new_key.bytes[0x1e] = 0xbd;
    new_key.bytes[0x1f] = 0xbd;
    fVar3 = fdb_rekey(pfStack_1dc08,new_key);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119c79;
    fdb_kvs_close(pfStack_1dc10);
    fdb_close(pfStack_1dc08);
    fStack_1dba0.encryption_key.algorithm = -1;
    builtin_memcpy(fStack_1dba0.encryption_key.bytes,"bar",4);
    fStack_1dba0.encryption_key.bytes[4] = 0xbd;
    fStack_1dba0.encryption_key.bytes[5] = 0xbd;
    fStack_1dba0.encryption_key.bytes[6] = 0xbd;
    fStack_1dba0.encryption_key.bytes[7] = 0xbd;
    fStack_1dba0.encryption_key.bytes[8] = 0xbd;
    fStack_1dba0.encryption_key.bytes[9] = 0xbd;
    fStack_1dba0.encryption_key.bytes[10] = 0xbd;
    fStack_1dba0.encryption_key.bytes[0xb] = 0xbd;
    fStack_1dba0.encryption_key.bytes[0xc] = 0xbd;
    fStack_1dba0.encryption_key.bytes[0xd] = 0xbd;
    fStack_1dba0.encryption_key.bytes[0xe] = 0xbd;
    fStack_1dba0.encryption_key.bytes[0xf] = 0xbd;
    fStack_1dba0.encryption_key.bytes[0x10] = 0xbd;
    fStack_1dba0.encryption_key.bytes[0x11] = 0xbd;
    fStack_1dba0.encryption_key.bytes[0x12] = 0xbd;
    fStack_1dba0.encryption_key.bytes[0x13] = 0xbd;
    fStack_1dba0.encryption_key.bytes[0x14] = 0xbd;
    fStack_1dba0.encryption_key.bytes[0x15] = 0xbd;
    fStack_1dba0.encryption_key.bytes[0x16] = 0xbd;
    fStack_1dba0.encryption_key.bytes[0x17] = 0xbd;
    fStack_1dba0.encryption_key.bytes[0x18] = 0xbd;
    fStack_1dba0.encryption_key.bytes[0x19] = 0xbd;
    fStack_1dba0.encryption_key.bytes[0x1a] = 0xbd;
    fStack_1dba0.encryption_key.bytes[0x1b] = 0xbd;
    fStack_1dba0.encryption_key.bytes[0x1c] = 0xbd;
    fStack_1dba0.encryption_key.bytes[0x1d] = 0xbd;
    fStack_1dba0.encryption_key.bytes[0x1e] = 0xbd;
    fStack_1dba0.encryption_key.bytes[0x1f] = 0xbd;
    fVar3 = fdb_open(&pfStack_1dc08,"./dummy1",&fStack_1dba0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119c80;
    fVar3 = fdb_kvs_open_default(pfStack_1dc08,&pfStack_1dc10,&fStack_1dbc8);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      fVar3 = fdb_set_log_callback(pfStack_1dc10,logCallbackFunc,"api_wrapper_test");
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119c8e;
      uVar19 = 0;
      while( true ) {
        sprintf(acStack_1d9a8,"key%d",uVar19);
        pfVar10 = pfStack_1dc10;
        sVar6 = strlen(acStack_1d9a8);
        fVar3 = fdb_get_kv(pfVar10,acStack_1d9a8,sVar6,&pvStack_1dc00,asStack_1dbf8);
        if (fVar3 != FDB_RESULT_SUCCESS) break;
        sprintf(acStack_1daa8,"body%d",uVar19);
        ptr = pvStack_1dc00;
        iVar4 = bcmp(pvStack_1dc00,acStack_1daa8,asStack_1dbf8[0]);
        if (iVar4 != 0) goto LAB_00119c56;
        fdb_free_block(ptr);
        uVar16 = (int)uVar19 + 1;
        uVar19 = (ulong)uVar16;
        if (uVar16 == 10) {
          fdb_kvs_close(pfStack_1dc10);
          fdb_close(pfStack_1dc08);
          fdb_shutdown();
          memleak_end();
          pcVar18 = "%s PASSED\n";
          if (rekey_test()::__test_pass != '\0') {
            pcVar18 = "%s FAILED\n";
          }
          fprintf(_stderr,pcVar18,"encryption rekey test");
          return;
        }
      }
LAB_00119c66:
      rekey_test();
      goto LAB_00119c6d;
    }
  }
  else {
LAB_00119c6d:
    rekey_test();
LAB_00119c74:
    rekey_test();
LAB_00119c79:
    rekey_test();
LAB_00119c80:
    rekey_test();
  }
  rekey_test();
LAB_00119c8e:
  rekey_test();
  return;
}

Assistant:

void doc_compression_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 10;
    int dummy_len = 32;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc = NULL;
    fdb_status status;

    char keybuf[256], metabuf[256], bodybuf[256], temp[256];

    // remove previous dummy files
    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compress_document_body = true;
    fconfig.compaction_threshold = 0;
    fconfig.purging_interval = 1;

    // open db
    fdb_open(&dbfile, "./dummy1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "doc_compression_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // set dummy str
    memset(temp, 'a', dummy_len);
    temp[dummy_len]=0;

    // insert documents
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d_%s", i, temp);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    // remove document #5
    fdb_doc_create(&rdoc, doc[5]->key, doc[5]->keylen, doc[5]->meta, doc[5]->metalen, NULL, 0);
    status = fdb_del(db, rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // commit
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // close the db
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // reopen
    fdb_open(&dbfile, "./dummy1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "doc_compression_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // update dummy str
    dummy_len = 64;
    memset(temp, 'b', dummy_len);
    temp[dummy_len]=0;

    // update document #0 and #1
    for (i=0;i<2;++i){
        sprintf(metabuf, "newmeta%d", i);
        sprintf(bodybuf, "newbody%d_%s", i, temp);
        fdb_doc_update(&doc[i], (void *)metabuf, strlen(metabuf),
            (void *)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    // commit
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // retrieve documents
    for (i=0;i<n;++i){
        // search by key
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);

        if (i != 5) {
            // updated documents
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
            TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
        } else {
            // removed document
            TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
        }

        // free result document
        fdb_doc_free(rdoc);
        rdoc = NULL;
    }

    // do compaction
    fdb_compact(dbfile, (char *) "./dummy2");

    // retrieve documents after compaction
    for (i=0;i<n;++i){
        // search by key
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);

        if (i != 5) {
            // updated documents
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
            TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
        } else {
            // removed document
            TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
        }

        // free result document
        fdb_doc_free(rdoc);
        rdoc = NULL;
    }

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // close db file
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("document compression test");
}